

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct64x64_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int *piVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [12];
  longlong lVar68;
  longlong lVar69;
  longlong lVar70;
  longlong lVar71;
  longlong lVar72;
  longlong lVar73;
  longlong lVar74;
  int iVar75;
  ulong uVar76;
  undefined1 *puVar77;
  uint *puVar78;
  int iVar79;
  long lVar80;
  long lVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  int iVar128;
  uint uVar129;
  int iVar134;
  int iVar136;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint uVar135;
  uint uVar137;
  int iVar138;
  uint uVar139;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  int iVar164;
  uint uVar165;
  int iVar170;
  uint uVar171;
  int iVar172;
  uint uVar173;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  int iVar174;
  uint uVar175;
  __m128i rnding;
  __m128i clamp_lo_out;
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  int local_5a8;
  int iStack_5a4;
  int iStack_5a0;
  int iStack_59c;
  int local_588;
  int iStack_584;
  int iStack_580;
  int iStack_57c;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  int local_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int local_528;
  int iStack_524;
  int iStack_520;
  int iStack_51c;
  uint local_458 [8];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  uint local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  uint local_3e8 [7];
  uint uStack_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_368 [11];
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  uint local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  uint local_268 [4];
  undefined1 local_258 [16];
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  undefined1 local_1e8 [16];
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  undefined1 local_198 [16];
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  undefined1 local_168 [16];
  uint local_158 [7];
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  undefined1 local_d8 [16];
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  undefined1 local_68 [16];
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  lVar80 = (long)bit * 0x100;
  iVar88 = 1 << ((char)bit - 1U & 0x1f);
  iVar91 = bd + (uint)(do_cols == 0) * 2;
  iVar75 = 0x8000;
  if (0xf < iVar91 + 6) {
    iVar75 = 1 << ((char)iVar91 + 5U & 0x1f);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x164);
  auVar113._4_4_ = uVar2;
  auVar113._0_4_ = uVar2;
  auVar113._8_4_ = uVar2;
  auVar113._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x16c);
  auVar94._4_4_ = uVar2;
  auVar94._0_4_ = uVar2;
  auVar94._8_4_ = uVar2;
  auVar94._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x174);
  auVar152._4_4_ = uVar2;
  auVar152._0_4_ = uVar2;
  auVar152._8_4_ = uVar2;
  auVar152._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x17c);
  auVar146._4_4_ = uVar2;
  auVar146._0_4_ = uVar2;
  auVar146._8_4_ = uVar2;
  auVar146._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x184);
  auVar166._4_4_ = uVar2;
  auVar166._0_4_ = uVar2;
  auVar166._8_4_ = uVar2;
  auVar166._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x18c);
  auVar140._4_4_ = uVar2;
  auVar140._0_4_ = uVar2;
  auVar140._8_4_ = uVar2;
  auVar140._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x194);
  auVar124._4_4_ = uVar2;
  auVar124._0_4_ = uVar2;
  auVar124._8_4_ = uVar2;
  auVar124._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x19c);
  auVar130._4_4_ = uVar2;
  auVar130._0_4_ = uVar2;
  auVar130._8_4_ = uVar2;
  auVar130._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x23c);
  auVar161._4_4_ = uVar2;
  auVar161._0_4_ = uVar2;
  auVar161._8_4_ = uVar2;
  auVar161._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x24c);
  auVar100._4_4_ = uVar2;
  auVar100._0_4_ = uVar2;
  auVar100._8_4_ = uVar2;
  auVar100._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x25c);
  auVar144._4_4_ = uVar2;
  auVar144._0_4_ = uVar2;
  auVar144._8_4_ = uVar2;
  auVar144._12_4_ = uVar2;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar80 + 0x224);
  auVar141._4_4_ = iVar91;
  auVar141._0_4_ = iVar91;
  auVar141._8_4_ = iVar91;
  auVar141._12_4_ = iVar91;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar80 + 0x234);
  auVar158._4_4_ = iVar91;
  auVar158._0_4_ = iVar91;
  auVar158._8_4_ = iVar91;
  auVar158._12_4_ = iVar91;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar80 + 0x244);
  auVar154._4_4_ = iVar91;
  auVar154._0_4_ = iVar91;
  auVar154._8_4_ = iVar91;
  auVar154._12_4_ = iVar91;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar80 + 0x254);
  auVar157._4_4_ = iVar91;
  auVar157._0_4_ = iVar91;
  auVar157._8_4_ = iVar91;
  auVar157._12_4_ = iVar91;
  auVar67 = *(undefined1 (*) [12])*in;
  puVar78 = (uint *)local_1e8;
  local_458[0] = (uint)(*in)[0];
  local_458[1] = (uint)((ulong)(*in)[0] >> 0x20);
  local_458[2] = (uint)(*in)[1];
  local_458[3] = (uint)((ulong)(*in)[1] >> 0x20);
  auVar108 = pmulld(auVar113,(undefined1  [16])in[1]);
  auVar145 = pmulld(auVar144,(undefined1  [16])in[1]);
  auVar109 = pmulld(auVar141,(undefined1  [16])in[0xf]);
  auVar131 = pmulld(auVar130,(undefined1  [16])in[0xf]);
  auVar167 = pmulld(auVar166,(undefined1  [16])in[9]);
  auVar162 = pmulld(auVar161,(undefined1  [16])in[9]);
  auVar155 = pmulld(auVar154,(undefined1  [16])in[7]);
  auVar113 = pmulld(auVar146,(undefined1  [16])in[7]);
  auVar153 = pmulld(auVar152,(undefined1  [16])in[5]);
  auVar102 = pmulld(auVar100,(undefined1  [16])in[5]);
  auVar120 = pmulld(auVar158,(undefined1  [16])in[0xb]);
  auVar141 = pmulld(auVar140,(undefined1  [16])in[0xb]);
  auVar158 = pmulld(auVar157,(undefined1  [16])in[3]);
  auVar94 = pmulld(auVar94,(undefined1  [16])in[3]);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x22c);
  auVar95._4_4_ = uVar2;
  auVar95._0_4_ = uVar2;
  auVar95._8_4_ = uVar2;
  auVar95._12_4_ = uVar2;
  auVar125 = pmulld(auVar124,(undefined1  [16])in[0xd]);
  auVar95 = pmulld(auVar95,(undefined1  [16])in[0xd]);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x168);
  auVar103._4_4_ = uVar2;
  auVar103._0_4_ = uVar2;
  auVar103._8_4_ = uVar2;
  auVar103._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 600);
  auVar96._4_4_ = uVar2;
  auVar96._0_4_ = uVar2;
  auVar96._8_4_ = uVar2;
  auVar96._12_4_ = uVar2;
  auVar103 = pmulld(auVar103,(undefined1  [16])in[2]);
  auVar96 = pmulld(auVar96,(undefined1  [16])in[2]);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x198);
  auVar97._4_4_ = uVar2;
  auVar97._0_4_ = uVar2;
  auVar97._8_4_ = uVar2;
  auVar97._12_4_ = uVar2;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar80 + 0x228);
  auVar104._4_4_ = iVar91;
  auVar104._0_4_ = iVar91;
  auVar104._8_4_ = iVar91;
  auVar104._12_4_ = iVar91;
  auVar104 = pmulld(auVar104,(undefined1  [16])in[0xe]);
  auVar97 = pmulld(auVar97,(undefined1  [16])in[0xe]);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x188);
  auVar105._4_4_ = uVar2;
  auVar105._0_4_ = uVar2;
  auVar105._8_4_ = uVar2;
  auVar105._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x238);
  auVar98._4_4_ = uVar2;
  auVar98._0_4_ = uVar2;
  auVar98._8_4_ = uVar2;
  auVar98._12_4_ = uVar2;
  auVar105 = pmulld(auVar105,(undefined1  [16])in[10]);
  auVar98 = pmulld(auVar98,(undefined1  [16])in[10]);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar80 + 0x178);
  auVar99._4_4_ = uVar2;
  auVar99._0_4_ = uVar2;
  auVar99._8_4_ = uVar2;
  auVar99._12_4_ = uVar2;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar80 + 0x248);
  auVar106._4_4_ = iVar91;
  auVar106._0_4_ = iVar91;
  auVar106._8_4_ = iVar91;
  auVar106._12_4_ = iVar91;
  auVar106 = pmulld(auVar106,(undefined1  [16])in[6]);
  auVar99 = pmulld(auVar99,(undefined1  [16])in[6]);
  iVar91 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x170);
  iVar89 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x250);
  auVar159._4_4_ = iVar89;
  auVar159._0_4_ = iVar89;
  auVar159._8_4_ = iVar89;
  auVar159._12_4_ = iVar89;
  iVar82 = -iVar91;
  auVar107._4_4_ = iVar82;
  auVar107._0_4_ = iVar82;
  auVar107._8_4_ = iVar82;
  auVar107._12_4_ = iVar82;
  auVar100 = ZEXT416((uint)bit);
  local_68._0_4_ = auVar108._0_4_ + iVar88 >> auVar100;
  local_68._4_4_ = auVar108._4_4_ + iVar88 >> auVar100;
  local_68._8_4_ = auVar108._8_4_ + iVar88 >> auVar100;
  local_68._12_4_ = auVar108._12_4_ + iVar88 >> auVar100;
  local_258._0_4_ = auVar145._0_4_ + iVar88 >> auVar100;
  local_258._4_4_ = auVar145._4_4_ + iVar88 >> auVar100;
  local_258._8_4_ = auVar145._8_4_ + iVar88 >> auVar100;
  local_258._12_4_ = auVar145._12_4_ + iVar88 >> auVar100;
  auVar145 = pmulld(local_258,auVar107);
  auVar146 = pmulld(local_68,auVar159);
  iVar89 = -iVar89;
  local_228._0_4_ = auVar109._0_4_ + iVar88 >> auVar100;
  local_228._4_4_ = auVar109._4_4_ + iVar88 >> auVar100;
  local_228._8_4_ = auVar109._8_4_ + iVar88 >> auVar100;
  local_228._12_4_ = auVar109._12_4_ + iVar88 >> auVar100;
  local_98._0_4_ = auVar131._0_4_ + iVar88 >> auVar100;
  local_98._4_4_ = auVar131._4_4_ + iVar88 >> auVar100;
  local_98._8_4_ = auVar131._8_4_ + iVar88 >> auVar100;
  local_98._12_4_ = auVar131._12_4_ + iVar88 >> auVar100;
  auVar114._4_4_ = iVar89;
  auVar114._0_4_ = iVar89;
  auVar114._8_4_ = iVar89;
  auVar114._12_4_ = iVar89;
  auVar109 = pmulld(auVar114,local_228);
  auVar147 = pmulld(local_98,auVar107);
  iVar89 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x1d0);
  auVar108._4_4_ = iVar89;
  auVar108._0_4_ = iVar89;
  auVar108._8_4_ = iVar89;
  auVar108._12_4_ = iVar89;
  iVar82 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x1f0);
  iVar90 = -iVar82;
  local_a8._0_4_ = auVar167._0_4_ + iVar88 >> auVar100;
  local_a8._4_4_ = auVar167._4_4_ + iVar88 >> auVar100;
  local_a8._8_4_ = auVar167._8_4_ + iVar88 >> auVar100;
  local_a8._12_4_ = auVar167._12_4_ + iVar88 >> auVar100;
  auVar167._4_4_ = iVar90;
  auVar167._0_4_ = iVar90;
  auVar167._8_4_ = iVar90;
  auVar167._12_4_ = iVar90;
  local_218._0_4_ = auVar162._0_4_ + iVar88 >> auVar100;
  local_218._4_4_ = auVar162._4_4_ + iVar88 >> auVar100;
  local_218._8_4_ = auVar162._8_4_ + iVar88 >> auVar100;
  local_218._12_4_ = auVar162._12_4_ + iVar88 >> auVar100;
  auVar131 = pmulld(local_218,auVar167);
  auVar163 = pmulld(local_a8,auVar108);
  iVar89 = -iVar89;
  auVar162._4_4_ = iVar89;
  auVar162._0_4_ = iVar89;
  auVar162._8_4_ = iVar89;
  auVar162._12_4_ = iVar89;
  local_1e8._0_4_ = auVar155._0_4_ + iVar88 >> auVar100;
  local_1e8._4_4_ = auVar155._4_4_ + iVar88 >> auVar100;
  local_1e8._8_4_ = auVar155._8_4_ + iVar88 >> auVar100;
  local_1e8._12_4_ = auVar155._12_4_ + iVar88 >> auVar100;
  local_5d8 = auVar113._0_4_;
  iStack_5d4 = auVar113._4_4_;
  iStack_5d0 = auVar113._8_4_;
  iStack_5cc = auVar113._12_4_;
  local_d8._0_4_ = local_5d8 + iVar88 >> auVar100;
  local_d8._4_4_ = iStack_5d4 + iVar88 >> auVar100;
  local_d8._8_4_ = iStack_5d0 + iVar88 >> auVar100;
  local_d8._12_4_ = iStack_5cc + iVar88 >> auVar100;
  auVar113 = pmulld(auVar162,local_1e8);
  auVar114 = pmulld(local_d8,auVar167);
  auVar167 = pmulld(local_1e8,auVar167);
  auVar162 = pmulld(local_d8,auVar108);
  auVar155._4_4_ = iVar91;
  auVar155._0_4_ = iVar91;
  auVar155._8_4_ = iVar91;
  auVar155._12_4_ = iVar91;
  local_5b8._4_4_ = *(int *)((long)vert_filter_length_chroma + lVar80 + 400);
  local_5b8._0_4_ = local_5b8._4_4_;
  local_5b8._8_4_ = local_5b8._4_4_;
  local_5b8._12_4_ = local_5b8._4_4_;
  iVar91 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x230);
  iVar89 = -local_5b8._4_4_;
  auVar110._4_4_ = iVar89;
  auVar110._0_4_ = iVar89;
  auVar110._8_4_ = iVar89;
  auVar110._12_4_ = iVar89;
  iVar89 = -iVar91;
  auVar126._4_4_ = iVar89;
  auVar126._0_4_ = iVar89;
  auVar126._8_4_ = iVar89;
  auVar126._12_4_ = iVar89;
  local_5e8._0_4_ = auVar153._0_4_;
  local_5e8._4_4_ = auVar153._4_4_;
  local_5e8._8_4_ = auVar153._8_4_;
  local_5e8._12_4_ = auVar153._12_4_;
  local_5e8._0_4_ = local_5e8._0_4_ + iVar88 >> auVar100;
  local_5e8._4_4_ = local_5e8._4_4_ + iVar88 >> auVar100;
  local_5e8._8_4_ = local_5e8._8_4_ + iVar88 >> auVar100;
  local_5e8._12_4_ = local_5e8._12_4_ + iVar88 >> auVar100;
  local_e8 = local_5e8._0_4_;
  iStack_e4 = local_5e8._4_4_;
  iStack_e0 = local_5e8._8_4_;
  iStack_dc = local_5e8._12_4_;
  local_5f8._0_4_ = auVar102._0_4_;
  local_5f8._4_4_ = auVar102._4_4_;
  local_5f8._8_4_ = auVar102._8_4_;
  local_5f8._12_4_ = auVar102._12_4_;
  local_5f8._0_4_ = local_5f8._0_4_ + iVar88 >> auVar100;
  local_5f8._4_4_ = local_5f8._4_4_ + iVar88 >> auVar100;
  local_5f8._8_4_ = local_5f8._8_4_ + iVar88 >> auVar100;
  local_5f8._12_4_ = local_5f8._12_4_ + iVar88 >> auVar100;
  local_1d8 = local_5f8._0_4_;
  iStack_1d4 = local_5f8._4_4_;
  iStack_1d0 = local_5f8._8_4_;
  iStack_1cc = local_5f8._12_4_;
  local_558._0_4_ = auVar120._0_4_;
  local_558._4_4_ = auVar120._4_4_;
  local_558._8_4_ = auVar120._8_4_;
  local_558._12_4_ = auVar120._12_4_;
  local_558._0_4_ = local_558._0_4_ + iVar88 >> auVar100;
  local_558._4_4_ = local_558._4_4_ + iVar88 >> auVar100;
  local_558._8_4_ = local_558._8_4_ + iVar88 >> auVar100;
  local_558._12_4_ = local_558._12_4_ + iVar88 >> auVar100;
  local_1a8 = local_558._0_4_;
  iStack_1a4 = local_558._4_4_;
  iStack_1a0 = local_558._8_4_;
  iStack_19c = local_558._12_4_;
  local_628._0_4_ = auVar141._0_4_;
  local_628._4_4_ = auVar141._4_4_;
  local_628._8_4_ = auVar141._8_4_;
  local_628._12_4_ = auVar141._12_4_;
  local_628._0_4_ = local_628._0_4_ + iVar88 >> auVar100;
  local_628._4_4_ = local_628._4_4_ + iVar88 >> auVar100;
  local_628._8_4_ = local_628._8_4_ + iVar88 >> auVar100;
  local_628._12_4_ = local_628._12_4_ + iVar88 >> auVar100;
  local_118 = local_628._0_4_;
  iStack_114 = local_628._4_4_;
  iStack_110 = local_628._8_4_;
  iStack_10c = local_628._12_4_;
  local_5a8 = auVar158._0_4_;
  iStack_5a4 = auVar158._4_4_;
  iStack_5a0 = auVar158._8_4_;
  iStack_59c = auVar158._12_4_;
  local_168._0_4_ = local_5a8 + iVar88 >> auVar100;
  local_168._4_4_ = iStack_5a4 + iVar88 >> auVar100;
  local_168._8_4_ = iStack_5a0 + iVar88 >> auVar100;
  local_168._12_4_ = iStack_59c + iVar88 >> auVar100;
  local_608._0_4_ = auVar94._0_4_;
  local_608._4_4_ = auVar94._4_4_;
  local_608._8_4_ = auVar94._8_4_;
  local_608._12_4_ = auVar94._12_4_;
  local_608._0_4_ = local_608._0_4_ + iVar88 >> auVar100;
  local_608._4_4_ = local_608._4_4_ + iVar88 >> auVar100;
  local_608._8_4_ = local_608._8_4_ + iVar88 >> auVar100;
  local_608._12_4_ = local_608._12_4_ + iVar88 >> auVar100;
  local_158[0] = local_608._0_4_;
  local_158[1] = local_608._4_4_;
  local_158[2] = local_608._8_4_;
  local_158[3] = local_608._12_4_;
  local_578._0_4_ = auVar125._0_4_;
  local_578._4_4_ = auVar125._4_4_;
  local_578._8_4_ = auVar125._8_4_;
  local_578._12_4_ = auVar125._12_4_;
  local_578._0_4_ = local_578._0_4_ + iVar88 >> auVar100;
  local_578._4_4_ = local_578._4_4_ + iVar88 >> auVar100;
  local_578._8_4_ = local_578._8_4_ + iVar88 >> auVar100;
  local_578._12_4_ = local_578._12_4_ + iVar88 >> auVar100;
  local_128 = local_578._0_4_;
  iStack_124 = local_578._4_4_;
  iStack_120 = local_578._8_4_;
  iStack_11c = local_578._12_4_;
  local_588 = auVar95._0_4_;
  iStack_584 = auVar95._4_4_;
  iStack_580 = auVar95._8_4_;
  iStack_57c = auVar95._12_4_;
  local_198._0_4_ = local_588 + iVar88 >> auVar100;
  local_198._4_4_ = iStack_584 + iVar88 >> auVar100;
  local_198._8_4_ = iStack_580 + iVar88 >> auVar100;
  local_198._12_4_ = iStack_57c + iVar88 >> auVar100;
  local_658._0_4_ = auVar103._0_4_;
  local_658._4_4_ = auVar103._4_4_;
  local_658._8_4_ = auVar103._8_4_;
  local_658._12_4_ = auVar103._12_4_;
  local_658._0_4_ = local_658._0_4_ + iVar88 >> auVar100;
  local_658._4_4_ = local_658._4_4_ + iVar88 >> auVar100;
  local_658._8_4_ = local_658._8_4_ + iVar88 >> auVar100;
  local_658._12_4_ = local_658._12_4_ + iVar88 >> auVar100;
  local_268[0] = local_658._0_4_;
  local_268[1] = local_658._4_4_;
  local_268[2] = local_658._8_4_;
  local_268[3] = local_658._12_4_;
  local_678._0_4_ = auVar96._0_4_;
  local_678._4_4_ = auVar96._4_4_;
  local_678._8_4_ = auVar96._8_4_;
  local_678._12_4_ = auVar96._12_4_;
  local_678._0_4_ = local_678._0_4_ + iVar88 >> auVar100;
  local_678._4_4_ = local_678._4_4_ + iVar88 >> auVar100;
  local_678._8_4_ = local_678._8_4_ + iVar88 >> auVar100;
  local_678._12_4_ = local_678._12_4_ + iVar88 >> auVar100;
  local_368[4] = local_678._0_4_;
  local_368[5] = local_678._4_4_;
  local_368[6] = local_678._8_4_;
  local_368[7] = local_678._12_4_;
  local_638._0_4_ = auVar104._0_4_;
  local_638._4_4_ = auVar104._4_4_;
  local_638._8_4_ = auVar104._8_4_;
  local_638._12_4_ = auVar104._12_4_;
  local_638._0_4_ = local_638._0_4_ + iVar88 >> auVar100;
  local_638._4_4_ = local_638._4_4_ + iVar88 >> auVar100;
  local_638._8_4_ = local_638._8_4_ + iVar88 >> auVar100;
  local_638._12_4_ = local_638._12_4_ + iVar88 >> auVar100;
  local_328 = local_638._0_4_;
  iStack_324 = local_638._4_4_;
  iStack_320 = local_638._8_4_;
  iStack_31c = local_638._12_4_;
  local_648._0_4_ = auVar97._0_4_;
  local_648._4_4_ = auVar97._4_4_;
  local_648._8_4_ = auVar97._8_4_;
  local_648._12_4_ = auVar97._12_4_;
  local_648._0_4_ = local_648._0_4_ + iVar88 >> auVar100;
  local_648._4_4_ = local_648._4_4_ + iVar88 >> auVar100;
  local_648._8_4_ = local_648._8_4_ + iVar88 >> auVar100;
  local_648._12_4_ = local_648._12_4_ + iVar88 >> auVar100;
  local_298 = local_648._0_4_;
  iStack_294 = local_648._4_4_;
  iStack_290 = local_648._8_4_;
  iStack_28c = local_648._12_4_;
  local_668._0_4_ = auVar105._0_4_;
  local_668._4_4_ = auVar105._4_4_;
  local_668._8_4_ = auVar105._8_4_;
  local_668._12_4_ = auVar105._12_4_;
  local_668._0_4_ = local_668._0_4_ + iVar88 >> auVar100;
  local_668._4_4_ = local_668._4_4_ + iVar88 >> auVar100;
  local_668._8_4_ = local_668._8_4_ + iVar88 >> auVar100;
  local_668._12_4_ = local_668._12_4_ + iVar88 >> auVar100;
  local_2a8 = local_668._0_4_;
  iStack_2a4 = local_668._4_4_;
  iStack_2a0 = local_668._8_4_;
  iStack_29c = local_668._12_4_;
  local_5c8._0_4_ = auVar98._0_4_;
  local_5c8._4_4_ = auVar98._4_4_;
  local_5c8._8_4_ = auVar98._8_4_;
  local_5c8._12_4_ = auVar98._12_4_;
  local_5c8._0_4_ = local_5c8._0_4_ + iVar88 >> auVar100;
  local_5c8._4_4_ = local_5c8._4_4_ + iVar88 >> auVar100;
  local_5c8._8_4_ = local_5c8._8_4_ + iVar88 >> auVar100;
  local_5c8._12_4_ = local_5c8._12_4_ + iVar88 >> auVar100;
  local_318 = local_5c8._0_4_;
  iStack_314 = local_5c8._4_4_;
  iStack_310 = local_5c8._8_4_;
  iStack_30c = local_5c8._12_4_;
  local_618._0_4_ = auVar106._0_4_;
  local_618._4_4_ = auVar106._4_4_;
  local_618._8_4_ = auVar106._8_4_;
  local_618._12_4_ = auVar106._12_4_;
  local_618._0_4_ = local_618._0_4_ + iVar88 >> auVar100;
  local_618._4_4_ = local_618._4_4_ + iVar88 >> auVar100;
  local_618._8_4_ = local_618._8_4_ + iVar88 >> auVar100;
  local_618._12_4_ = local_618._12_4_ + iVar88 >> auVar100;
  local_2e8 = local_618._0_4_;
  iStack_2e4 = local_618._4_4_;
  iStack_2e0 = local_618._8_4_;
  iStack_2dc = local_618._12_4_;
  local_568._0_4_ = auVar99._0_4_;
  local_568._4_4_ = auVar99._4_4_;
  local_568._8_4_ = auVar99._8_4_;
  local_568._12_4_ = auVar99._12_4_;
  local_568._0_4_ = local_568._0_4_ + iVar88 >> auVar100;
  local_568._4_4_ = local_568._4_4_ + iVar88 >> auVar100;
  local_568._8_4_ = local_568._8_4_ + iVar88 >> auVar100;
  local_568._12_4_ = local_568._12_4_ + iVar88 >> auVar100;
  auVar104 = pmulld(local_68,auVar155);
  auVar94 = pmulld(auVar155,(undefined1  [16])in[4]);
  local_368[0] = auVar94._0_4_ + iVar88 >> auVar100;
  local_368[1] = auVar94._4_4_ + iVar88 >> auVar100;
  local_368[2] = auVar94._8_4_ + iVar88 >> auVar100;
  local_368[3] = auVar94._12_4_ + iVar88 >> auVar100;
  local_2d8 = local_568._0_4_;
  iStack_2d4 = local_568._4_4_;
  iStack_2d0 = local_568._8_4_;
  iStack_2cc = local_568._12_4_;
  auVar94 = pmulld((undefined1  [16])in[4],auVar159);
  local_3e8[4] = auVar94._0_4_ + iVar88 >> auVar100;
  local_3e8[5] = auVar94._4_4_ + iVar88 >> auVar100;
  local_3e8[6] = auVar94._8_4_ + iVar88 >> auVar100;
  uStack_3cc = auVar94._12_4_ + iVar88 >> auVar100;
  auVar98 = pmulld(local_198,auVar126);
  auVar96 = pmulld(auVar110,local_168);
  auVar97 = pmulld(local_608,auVar126);
  auVar103 = pmulld(local_168,auVar126);
  auVar94 = pmulld(auVar126,(undefined1  [16])in[0xc]);
  local_3a8 = auVar94._0_4_ + iVar88 >> auVar100;
  uStack_3a4 = auVar94._4_4_ + iVar88 >> auVar100;
  uStack_3a0 = auVar94._8_4_ + iVar88 >> auVar100;
  uStack_39c = auVar94._12_4_ + iVar88 >> auVar100;
  auVar94 = pmulld((undefined1  [16])in[0xc],local_5b8);
  local_398 = auVar94._0_4_ + iVar88 >> auVar100;
  uStack_394 = auVar94._4_4_ + iVar88 >> auVar100;
  uStack_390 = auVar94._8_4_ + iVar88 >> auVar100;
  uStack_38c = auVar94._12_4_ + iVar88 >> auVar100;
  local_c8 = auVar162._0_4_ + iVar88 + auVar167._0_4_ >> auVar100;
  iStack_c4 = auVar162._4_4_ + iVar88 + auVar167._4_4_ >> auVar100;
  iStack_c0 = auVar162._8_4_ + iVar88 + auVar167._8_4_ >> auVar100;
  iStack_bc = auVar162._12_4_ + iVar88 + auVar167._12_4_ >> auVar100;
  auVar99 = pmulld(local_218,auVar108);
  auVar102._4_4_ = iVar82;
  auVar102._0_4_ = iVar82;
  auVar102._8_4_ = iVar82;
  auVar102._12_4_ = iVar82;
  auVar94 = pmulld(local_a8,auVar102);
  auVar95 = pmulld(local_228,auVar107);
  auVar102 = pmulld(local_98,auVar159);
  local_b8 = auVar94._0_4_ + iVar88 + auVar99._0_4_ >> auVar100;
  iStack_b4 = auVar94._4_4_ + iVar88 + auVar99._4_4_ >> auVar100;
  iStack_b0 = auVar94._8_4_ + iVar88 + auVar99._8_4_ >> auVar100;
  iStack_ac = auVar94._12_4_ + iVar88 + auVar99._12_4_ >> auVar100;
  local_88 = auVar102._0_4_ + iVar88 + auVar95._0_4_ >> auVar100;
  iStack_84 = auVar102._4_4_ + iVar88 + auVar95._4_4_ >> auVar100;
  iStack_80 = auVar102._8_4_ + iVar88 + auVar95._8_4_ >> auVar100;
  iStack_7c = auVar102._12_4_ + iVar88 + auVar95._12_4_ >> auVar100;
  auVar159 = pmulld(local_258,auVar159);
  local_78 = auVar104._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  iStack_74 = auVar104._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  iStack_70 = auVar104._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  iStack_6c = auVar104._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  local_248 = auVar146._0_4_ + iVar88 + auVar145._0_4_ >> auVar100;
  iStack_244 = auVar146._4_4_ + iVar88 + auVar145._4_4_ >> auVar100;
  iStack_240 = auVar146._8_4_ + iVar88 + auVar145._8_4_ >> auVar100;
  iStack_23c = auVar146._12_4_ + iVar88 + auVar145._12_4_ >> auVar100;
  local_238 = auVar147._0_4_ + iVar88 + auVar109._0_4_ >> auVar100;
  iStack_234 = auVar147._4_4_ + iVar88 + auVar109._4_4_ >> auVar100;
  iStack_230 = auVar147._8_4_ + iVar88 + auVar109._8_4_ >> auVar100;
  iStack_22c = auVar147._12_4_ + iVar88 + auVar109._12_4_ >> auVar100;
  local_208 = auVar163._0_4_ + iVar88 + auVar131._0_4_ >> auVar100;
  iStack_204 = auVar163._4_4_ + iVar88 + auVar131._4_4_ >> auVar100;
  iStack_200 = auVar163._8_4_ + iVar88 + auVar131._8_4_ >> auVar100;
  iStack_1fc = auVar163._12_4_ + iVar88 + auVar131._12_4_ >> auVar100;
  local_1f8 = auVar114._0_4_ + iVar88 + auVar113._0_4_ >> auVar100;
  iStack_1f4 = auVar114._4_4_ + iVar88 + auVar113._4_4_ >> auVar100;
  iStack_1f0 = auVar114._8_4_ + iVar88 + auVar113._8_4_ >> auVar100;
  iStack_1ec = auVar114._12_4_ + iVar88 + auVar113._12_4_ >> auVar100;
  iVar89 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x1b0);
  iVar82 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x210);
  auVar160._4_4_ = iVar82;
  auVar160._0_4_ = iVar82;
  auVar160._8_4_ = iVar82;
  auVar160._12_4_ = iVar82;
  iVar90 = -iVar89;
  auVar163._4_4_ = iVar90;
  auVar163._0_4_ = iVar90;
  auVar163._8_4_ = iVar90;
  auVar163._12_4_ = iVar90;
  auVar102 = pmulld(local_5f8,auVar163);
  auVar99 = pmulld(local_5e8,auVar160);
  iVar82 = -iVar82;
  auVar168._4_4_ = iVar82;
  auVar168._0_4_ = iVar82;
  auVar168._8_4_ = iVar82;
  auVar168._12_4_ = iVar82;
  auVar105 = pmulld(auVar168,local_558);
  auVar104 = pmulld(local_628,auVar163);
  auVar106 = pmulld(local_578,local_5b8);
  local_528 = auVar98._0_4_;
  iStack_524 = auVar98._4_4_;
  iStack_520 = auVar98._8_4_;
  iStack_51c = auVar98._12_4_;
  local_538 = auVar96._0_4_;
  iStack_534 = auVar96._4_4_;
  iStack_530 = auVar96._8_4_;
  iStack_52c = auVar96._12_4_;
  auVar94 = pmulld(local_608,local_5b8);
  local_5a8 = auVar103._0_4_;
  iStack_5a4 = auVar103._4_4_;
  iStack_5a0 = auVar103._8_4_;
  iStack_59c = auVar103._12_4_;
  auVar159 = pmulld(local_198,local_5b8);
  auVar147._4_4_ = iVar91;
  auVar147._0_4_ = iVar91;
  auVar147._8_4_ = iVar91;
  auVar147._12_4_ = iVar91;
  auVar95 = pmulld(local_578,auVar147);
  local_158[4] = auVar94._0_4_ + iVar88 + local_5a8 >> auVar100;
  local_158[5] = auVar94._4_4_ + iVar88 + iStack_5a4 >> auVar100;
  local_158[6] = auVar94._8_4_ + iVar88 + iStack_5a0 >> auVar100;
  iStack_13c = auVar94._12_4_ + iVar88 + iStack_59c >> auVar100;
  local_138 = auVar95._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  iStack_134 = auVar95._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  iStack_130 = auVar95._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  iStack_12c = auVar95._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  auVar159 = pmulld(local_558,auVar163);
  auVar94 = pmulld(local_628,auVar160);
  local_108 = auVar94._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  iStack_104 = auVar94._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  iStack_100 = auVar94._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  iStack_fc = auVar94._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  auVar159 = pmulld(local_5f8,auVar160);
  auVar145._4_4_ = iVar89;
  auVar145._0_4_ = iVar89;
  auVar145._8_4_ = iVar89;
  auVar145._12_4_ = iVar89;
  auVar94 = pmulld(local_5e8,auVar145);
  local_f8 = auVar94._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  iStack_f4 = auVar94._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  iStack_f0 = auVar94._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  iStack_ec = auVar94._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  local_1c8 = auVar99._0_4_ + iVar88 + auVar102._0_4_ >> auVar100;
  iStack_1c4 = auVar99._4_4_ + iVar88 + auVar102._4_4_ >> auVar100;
  iStack_1c0 = auVar99._8_4_ + iVar88 + auVar102._8_4_ >> auVar100;
  iStack_1bc = auVar99._12_4_ + iVar88 + auVar102._12_4_ >> auVar100;
  local_1b8 = auVar104._0_4_ + iVar88 + auVar105._0_4_ >> auVar100;
  iStack_1b4 = auVar104._4_4_ + iVar88 + auVar105._4_4_ >> auVar100;
  iStack_1b0 = auVar104._8_4_ + iVar88 + auVar105._8_4_ >> auVar100;
  iStack_1ac = auVar104._12_4_ + iVar88 + auVar105._12_4_ >> auVar100;
  local_188 = auVar106._0_4_ + iVar88 + local_528 >> auVar100;
  iStack_184 = auVar106._4_4_ + iVar88 + iStack_524 >> auVar100;
  iStack_180 = auVar106._8_4_ + iVar88 + iStack_520 >> auVar100;
  iStack_17c = auVar106._12_4_ + iVar88 + iStack_51c >> auVar100;
  iVar91 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x180);
  local_178 = auVar97._0_4_ + iVar88 + local_538 >> auVar100;
  iStack_174 = auVar97._4_4_ + iVar88 + iStack_534 >> auVar100;
  iStack_170 = auVar97._8_4_ + iVar88 + iStack_530 >> auVar100;
  iStack_16c = auVar97._12_4_ + iVar88 + iStack_52c >> auVar100;
  auVar109._4_4_ = iVar91;
  auVar109._0_4_ = iVar91;
  auVar109._8_4_ = iVar91;
  auVar109._12_4_ = iVar91;
  iVar89 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x240);
  auVar120._4_4_ = iVar89;
  auVar120._0_4_ = iVar89;
  auVar120._8_4_ = iVar89;
  auVar120._12_4_ = iVar89;
  auVar159 = pmulld(auVar109,(undefined1  [16])in[8]);
  local_3e8[0] = auVar159._0_4_ + iVar88 >> auVar100;
  local_3e8[1] = auVar159._4_4_ + iVar88 >> auVar100;
  local_3e8[2] = auVar159._8_4_ + iVar88 >> auVar100;
  local_3e8[3] = auVar159._12_4_ + iVar88 >> auVar100;
  auVar159 = pmulld((undefined1  [16])in[8],auVar120);
  local_418 = auVar159._0_4_ + iVar88 >> auVar100;
  iStack_414 = auVar159._4_4_ + iVar88 >> auVar100;
  iStack_410 = auVar159._8_4_ + iVar88 >> auVar100;
  iStack_40c = auVar159._12_4_ + iVar88 >> auVar100;
  iVar91 = -iVar91;
  local_3c8 = local_3e8[4];
  uStack_3c4 = local_3e8[5];
  uStack_3c0 = local_3e8[6];
  uStack_3bc = uStack_3cc;
  auVar169._4_4_ = iVar91;
  auVar169._0_4_ = iVar91;
  auVar169._8_4_ = iVar91;
  auVar169._12_4_ = iVar91;
  iVar89 = -iVar89;
  local_3b8 = local_3a8;
  uStack_3b4 = uStack_3a4;
  uStack_3b0 = uStack_3a0;
  uStack_3ac = uStack_39c;
  auVar125._4_4_ = iVar89;
  auVar125._0_4_ = iVar89;
  auVar125._8_4_ = iVar89;
  auVar125._12_4_ = iVar89;
  local_388 = local_398;
  uStack_384 = uStack_394;
  uStack_380 = uStack_390;
  uStack_37c = uStack_38c;
  local_378 = local_368[0];
  uStack_374 = local_368[1];
  uStack_370 = local_368[2];
  uStack_36c = local_368[3];
  auVar94 = pmulld(local_678,auVar169);
  auVar99 = pmulld(local_658,auVar120);
  auVar95 = pmulld(local_638,auVar125);
  auVar102 = pmulld(local_648,auVar169);
  iVar91 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x1c0);
  auVar142._4_4_ = iVar91;
  auVar142._0_4_ = iVar91;
  auVar142._8_4_ = iVar91;
  auVar142._12_4_ = iVar91;
  iVar89 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x200);
  iVar82 = -iVar89;
  auVar121._4_4_ = iVar82;
  auVar121._0_4_ = iVar82;
  auVar121._8_4_ = iVar82;
  auVar121._12_4_ = iVar82;
  auVar96 = pmulld(local_5c8,auVar121);
  auVar103 = pmulld(local_668,auVar142);
  iVar91 = -iVar91;
  auVar153._4_4_ = iVar91;
  auVar153._0_4_ = iVar91;
  auVar153._8_4_ = iVar91;
  auVar153._12_4_ = iVar91;
  auVar97 = pmulld(local_618,auVar153);
  auVar104 = pmulld(local_568,auVar121);
  auVar106 = pmulld(local_618,auVar121);
  auVar159 = pmulld(local_568,auVar142);
  auVar131._4_4_ = iVar89;
  auVar131._0_4_ = iVar89;
  auVar131._8_4_ = iVar89;
  auVar131._12_4_ = iVar89;
  auVar98 = pmulld(local_5c8,auVar142);
  auVar105 = pmulld(local_668,auVar131);
  local_2c8 = auVar159._0_4_ + iVar88 + auVar106._0_4_ >> auVar100;
  iStack_2c4 = auVar159._4_4_ + iVar88 + auVar106._4_4_ >> auVar100;
  iStack_2c0 = auVar159._8_4_ + iVar88 + auVar106._8_4_ >> auVar100;
  iStack_2bc = auVar159._12_4_ + iVar88 + auVar106._12_4_ >> auVar100;
  local_2b8 = auVar105._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_2b4 = auVar105._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_2b0 = auVar105._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_2ac = auVar105._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  auVar98 = pmulld(local_638,auVar169);
  auVar159 = pmulld(local_648,auVar120);
  local_288 = auVar159._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_284 = auVar159._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_280 = auVar159._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_27c = auVar159._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  iVar83 = -iVar75;
  auVar159 = pmulld(local_678,auVar120);
  auVar98 = pmulld(local_658,auVar109);
  iVar75 = iVar75 + -1;
  local_278 = auVar98._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  iStack_274 = auVar98._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  iStack_270 = auVar98._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  iStack_26c = auVar98._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  iVar91 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x1a0);
  iVar89 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x1e0);
  iVar82 = *(int *)((long)vert_filter_length_chroma + lVar80 + 0x220);
  local_368[8] = auVar99._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  local_368[9] = auVar99._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  local_368[10] = auVar99._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  iStack_33c = auVar99._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_338 = auVar102._0_4_ + iVar88 + auVar95._0_4_ >> auVar100;
  iStack_334 = auVar102._4_4_ + iVar88 + auVar95._4_4_ >> auVar100;
  iStack_330 = auVar102._8_4_ + iVar88 + auVar95._8_4_ >> auVar100;
  iStack_32c = auVar102._12_4_ + iVar88 + auVar95._12_4_ >> auVar100;
  local_308 = auVar103._0_4_ + iVar88 + auVar96._0_4_ >> auVar100;
  iStack_304 = auVar103._4_4_ + iVar88 + auVar96._4_4_ >> auVar100;
  iStack_300 = auVar103._8_4_ + iVar88 + auVar96._8_4_ >> auVar100;
  iStack_2fc = auVar103._12_4_ + iVar88 + auVar96._12_4_ >> auVar100;
  iVar90 = -iVar91;
  local_2f8 = auVar104._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  iStack_2f4 = auVar104._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  iStack_2f0 = auVar104._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  iStack_2ec = auVar104._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  iVar84 = -iVar89;
  iVar79 = -iVar82;
  uVar76 = 0x18;
  do {
    iVar164 = puVar78[-0x10] + puVar78[-0x1c];
    iVar170 = puVar78[-0xf] + puVar78[-0x1b];
    iVar172 = puVar78[-0xe] + puVar78[-0x1a];
    iVar174 = puVar78[-0xd] + puVar78[-0x19];
    iVar128 = puVar78[-0x1c] - puVar78[-0x10];
    iVar134 = puVar78[-0x1b] - puVar78[-0xf];
    iVar136 = puVar78[-0x1a] - puVar78[-0xe];
    iVar138 = puVar78[-0x19] - puVar78[-0xd];
    uVar165 = (uint)(iVar164 < iVar83) * iVar83 | (uint)(iVar164 >= iVar83) * iVar164;
    uVar171 = (uint)(iVar170 < iVar83) * iVar83 | (uint)(iVar170 >= iVar83) * iVar170;
    uVar173 = (uint)(iVar172 < iVar83) * iVar83 | (uint)(iVar172 >= iVar83) * iVar172;
    uVar175 = (uint)(iVar174 < iVar83) * iVar83 | (uint)(iVar174 >= iVar83) * iVar174;
    uVar129 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar135 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar137 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar139 = (uint)(iVar138 < iVar83) * iVar83 | (uint)(iVar138 >= iVar83) * iVar138;
    puVar78[-0x1c] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[-0x1b] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[-0x1a] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[-0x19] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    puVar78[-0x10] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-0xf] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-0xe] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-0xd] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    iVar128 = puVar78[-0x14] + puVar78[-0x18];
    iVar134 = puVar78[-0x13] + puVar78[-0x17];
    iVar136 = puVar78[-0x12] + puVar78[-0x16];
    iVar138 = puVar78[-0x11] + puVar78[-0x15];
    iVar164 = puVar78[-0x18] - puVar78[-0x14];
    iVar170 = puVar78[-0x17] - puVar78[-0x13];
    iVar172 = puVar78[-0x16] - puVar78[-0x12];
    iVar174 = puVar78[-0x15] - puVar78[-0x11];
    uVar129 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar135 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar137 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar139 = (uint)(iVar138 < iVar83) * iVar83 | (uint)(iVar138 >= iVar83) * iVar138;
    uVar165 = (uint)(iVar164 < iVar83) * iVar83 | (uint)(iVar164 >= iVar83) * iVar164;
    uVar171 = (uint)(iVar170 < iVar83) * iVar83 | (uint)(iVar170 >= iVar83) * iVar170;
    uVar173 = (uint)(iVar172 < iVar83) * iVar83 | (uint)(iVar172 >= iVar83) * iVar172;
    uVar175 = (uint)(iVar174 < iVar83) * iVar83 | (uint)(iVar174 >= iVar83) * iVar174;
    puVar78[-0x18] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-0x17] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-0x16] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-0x15] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    puVar78[-0x14] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[-0x13] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[-0x12] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[-0x11] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    iVar164 = puVar78[-0xc] + *puVar78;
    iVar170 = puVar78[-0xb] + puVar78[1];
    iVar172 = puVar78[-10] + puVar78[2];
    iVar174 = puVar78[-9] + puVar78[3];
    iVar128 = *puVar78 - puVar78[-0xc];
    iVar134 = puVar78[1] - puVar78[-0xb];
    iVar136 = puVar78[2] - puVar78[-10];
    iVar138 = puVar78[3] - puVar78[-9];
    uVar165 = (uint)(iVar164 < iVar83) * iVar83 | (uint)(iVar164 >= iVar83) * iVar164;
    uVar171 = (uint)(iVar170 < iVar83) * iVar83 | (uint)(iVar170 >= iVar83) * iVar170;
    uVar173 = (uint)(iVar172 < iVar83) * iVar83 | (uint)(iVar172 >= iVar83) * iVar172;
    uVar175 = (uint)(iVar174 < iVar83) * iVar83 | (uint)(iVar174 >= iVar83) * iVar174;
    uVar129 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar135 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar137 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar139 = (uint)(iVar138 < iVar83) * iVar83 | (uint)(iVar138 >= iVar83) * iVar138;
    *puVar78 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[1] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[3] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    puVar78[-0xc] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-0xb] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-10] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-9] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    iVar164 = puVar78[-8] + puVar78[-4];
    iVar170 = puVar78[-7] + puVar78[-3];
    iVar172 = puVar78[-6] + puVar78[-2];
    iVar174 = puVar78[-5] + puVar78[-1];
    iVar128 = puVar78[-4] - puVar78[-8];
    iVar134 = puVar78[-3] - puVar78[-7];
    iVar136 = puVar78[-2] - puVar78[-6];
    iVar138 = puVar78[-1] - puVar78[-5];
    uVar165 = (uint)(iVar164 < iVar83) * iVar83 | (uint)(iVar164 >= iVar83) * iVar164;
    uVar171 = (uint)(iVar170 < iVar83) * iVar83 | (uint)(iVar170 >= iVar83) * iVar170;
    uVar173 = (uint)(iVar172 < iVar83) * iVar83 | (uint)(iVar172 >= iVar83) * iVar172;
    uVar175 = (uint)(iVar174 < iVar83) * iVar83 | (uint)(iVar174 >= iVar83) * iVar174;
    uVar129 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar135 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar137 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar139 = (uint)(iVar138 < iVar83) * iVar83 | (uint)(iVar138 >= iVar83) * iVar138;
    puVar78[-4] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[-3] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[-2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[-1] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    puVar78[-8] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-7] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-6] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-5] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    uVar76 = uVar76 + 8;
    puVar78 = puVar78 + 0x20;
  } while (uVar76 < 0x38);
  auVar156._4_4_ = iVar91;
  auVar156._0_4_ = iVar91;
  auVar156._8_4_ = iVar91;
  auVar156._12_4_ = iVar91;
  auVar111._4_4_ = iVar89;
  auVar111._0_4_ = iVar89;
  auVar111._8_4_ = iVar89;
  auVar111._12_4_ = iVar89;
  auVar101._4_4_ = iVar82;
  auVar101._0_4_ = iVar82;
  auVar101._8_4_ = iVar82;
  auVar101._12_4_ = iVar82;
  auVar148._4_4_ = iVar90;
  auVar148._0_4_ = iVar90;
  auVar148._8_4_ = iVar90;
  auVar148._12_4_ = iVar90;
  puVar78 = &local_2e8;
  auVar3._12_4_ = local_458[3];
  auVar3._0_12_ = auVar67;
  auVar159 = pmulld(auVar3,auVar111);
  local_458[4] = auVar159._0_4_ + iVar88 >> auVar100;
  local_458[5] = auVar159._4_4_ + iVar88 >> auVar100;
  local_458[6] = auVar159._8_4_ + iVar88 >> auVar100;
  local_458[7] = auVar159._12_4_ + iVar88 >> auVar100;
  local_568._4_4_ = local_458[5];
  local_568._0_4_ = local_458[4];
  local_568._8_4_ = local_458[6];
  local_568._12_4_ = local_458[7];
  local_458[0] = local_458[4];
  local_458[1] = local_458[5];
  local_458[2] = local_458[6];
  local_458[3] = local_458[7];
  auVar6._4_4_ = local_3e8[5];
  auVar6._0_4_ = local_3e8[4];
  auVar6._8_4_ = local_3e8[6];
  auVar6._12_4_ = uStack_3cc;
  auVar7._4_4_ = uStack_3a4;
  auVar7._0_4_ = local_3a8;
  auVar7._8_4_ = uStack_3a0;
  auVar7._12_4_ = uStack_39c;
  local_408 = local_418;
  iStack_404 = iStack_414;
  iStack_400 = iStack_410;
  iStack_3fc = iStack_40c;
  local_3f8 = local_3e8[0];
  iStack_3f4 = local_3e8[1];
  iStack_3f0 = local_3e8[2];
  iStack_3ec = local_3e8[3];
  auVar13._4_4_ = local_368[1];
  auVar13._0_4_ = local_368[0];
  auVar13._8_4_ = local_368[2];
  auVar13._12_4_ = local_368[3];
  auVar159 = pmulld(auVar6,auVar148);
  auVar94 = pmulld(auVar13,auVar101);
  local_3c8 = auVar159._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  uStack_3c4 = auVar159._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  uStack_3c0 = auVar159._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  uStack_3bc = auVar159._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  auVar132._4_4_ = iVar79;
  auVar132._0_4_ = iVar79;
  auVar132._8_4_ = iVar79;
  auVar132._12_4_ = iVar79;
  auVar94 = pmulld(auVar6,auVar101);
  auVar159 = pmulld(auVar13,auVar156);
  local_378 = auVar94._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  uStack_374 = auVar94._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  uStack_370 = auVar94._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  uStack_36c = auVar94._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  auVar11._4_4_ = uStack_394;
  auVar11._0_4_ = local_398;
  auVar11._8_4_ = uStack_390;
  auVar11._12_4_ = uStack_38c;
  auVar159 = pmulld(auVar7,auVar132);
  auVar94 = pmulld(auVar11,auVar148);
  local_3b8 = auVar159._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  uStack_3b4 = auVar159._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  uStack_3b0 = auVar159._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  uStack_3ac = auVar159._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  auVar94 = pmulld(auVar7,auVar148);
  auVar159 = pmulld(auVar11,auVar101);
  local_388 = auVar94._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  uStack_384 = auVar94._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  uStack_380 = auVar94._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  uStack_37c = auVar94._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  uVar76 = 8;
  do {
    iVar79 = puVar78[-0x10] + puVar78[-0x1c];
    iVar128 = puVar78[-0xf] + puVar78[-0x1b];
    iVar134 = puVar78[-0xe] + puVar78[-0x1a];
    iVar136 = puVar78[-0xd] + puVar78[-0x19];
    iVar91 = puVar78[-0x1c] - puVar78[-0x10];
    iVar89 = puVar78[-0x1b] - puVar78[-0xf];
    iVar82 = puVar78[-0x1a] - puVar78[-0xe];
    iVar90 = puVar78[-0x19] - puVar78[-0xd];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar173 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar175 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    puVar78[-0x1c] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[-0x1b] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[-0x1a] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[-0x19] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    puVar78[-0x10] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-0xf] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-0xe] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-0xd] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    iVar91 = puVar78[-0x14] + puVar78[-0x18];
    iVar89 = puVar78[-0x13] + puVar78[-0x17];
    iVar82 = puVar78[-0x12] + puVar78[-0x16];
    iVar90 = puVar78[-0x11] + puVar78[-0x15];
    iVar79 = puVar78[-0x18] - puVar78[-0x14];
    iVar128 = puVar78[-0x17] - puVar78[-0x13];
    iVar134 = puVar78[-0x16] - puVar78[-0x12];
    iVar136 = puVar78[-0x15] - puVar78[-0x11];
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar173 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar175 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    puVar78[-0x18] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-0x17] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-0x16] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-0x15] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    puVar78[-0x14] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[-0x13] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[-0x12] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[-0x11] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    iVar79 = puVar78[-0xc] + *puVar78;
    iVar128 = puVar78[-0xb] + puVar78[1];
    iVar134 = puVar78[-10] + puVar78[2];
    iVar136 = puVar78[-9] + puVar78[3];
    iVar91 = *puVar78 - puVar78[-0xc];
    iVar89 = puVar78[1] - puVar78[-0xb];
    iVar82 = puVar78[2] - puVar78[-10];
    iVar90 = puVar78[3] - puVar78[-9];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar173 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar175 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    *puVar78 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[1] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[3] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    puVar78[-0xc] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-0xb] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-10] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-9] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    iVar79 = puVar78[-8] + puVar78[-4];
    iVar128 = puVar78[-7] + puVar78[-3];
    iVar134 = puVar78[-6] + puVar78[-2];
    iVar136 = puVar78[-5] + puVar78[-1];
    iVar91 = puVar78[-4] - puVar78[-8];
    iVar89 = puVar78[-3] - puVar78[-7];
    iVar82 = puVar78[-2] - puVar78[-6];
    iVar90 = puVar78[-1] - puVar78[-5];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar173 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar175 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    puVar78[-4] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[-3] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[-2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[-1] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    puVar78[-8] = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[-7] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[-6] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[-5] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    uVar76 = uVar76 + 8;
    puVar78 = puVar78 + 0x20;
  } while (uVar76 < 0x18);
  puVar77 = local_258;
  auVar66._4_4_ = iStack_84;
  auVar66._0_4_ = local_88;
  auVar66._8_4_ = iStack_80;
  auVar66._12_4_ = iStack_7c;
  auVar30._4_4_ = iStack_234;
  auVar30._0_4_ = local_238;
  auVar30._8_4_ = iStack_230;
  auVar30._12_4_ = iStack_22c;
  auVar104 = pmulld(auVar30,auVar169);
  auVar94 = pmulld(auVar66,auVar120);
  auVar95 = pmulld(local_228,auVar169);
  auVar99 = pmulld(local_98,auVar120);
  auVar103 = pmulld(local_218,auVar125);
  auVar102 = pmulld(local_a8,auVar169);
  auVar31._4_4_ = iStack_204;
  auVar31._0_4_ = local_208;
  auVar31._8_4_ = iStack_200;
  auVar31._12_4_ = iStack_1fc;
  auVar106 = pmulld(auVar125,auVar31);
  auVar64._4_4_ = iStack_b4;
  auVar64._0_4_ = local_b8;
  auVar64._8_4_ = iStack_b0;
  auVar64._12_4_ = iStack_ac;
  auVar105 = pmulld(auVar64,auVar169);
  auVar159 = pmulld(auVar31,auVar169);
  auVar96 = pmulld(auVar64,auVar120);
  local_b8 = auVar159._0_4_ + iVar88 + auVar96._0_4_ >> auVar100;
  iStack_b4 = auVar159._4_4_ + iVar88 + auVar96._4_4_ >> auVar100;
  iStack_b0 = auVar159._8_4_ + iVar88 + auVar96._8_4_ >> auVar100;
  iStack_ac = auVar159._12_4_ + iVar88 + auVar96._12_4_ >> auVar100;
  auVar96 = pmulld(local_218,auVar169);
  auVar159 = pmulld(local_a8,auVar120);
  local_a8._4_4_ = auVar96._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  local_a8._0_4_ = auVar96._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  local_a8._8_4_ = auVar96._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  local_a8._12_4_ = auVar96._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  auVar159 = pmulld(local_228,auVar120);
  auVar97 = pmulld(local_98,auVar109);
  auVar96 = pmulld(auVar30,auVar120);
  auVar98 = pmulld(auVar66,auVar109);
  local_98._4_4_ = auVar159._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  local_98._0_4_ = auVar159._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  local_98._8_4_ = auVar159._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  local_98._12_4_ = auVar159._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  local_88 = auVar96._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_84 = auVar96._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_80 = auVar96._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_7c = auVar96._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  local_238 = auVar104._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  iStack_234 = auVar104._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  iStack_230 = auVar104._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  iStack_22c = auVar104._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_228._4_4_ = auVar95._4_4_ + iVar88 + auVar99._4_4_ >> auVar100;
  local_228._0_4_ = auVar95._0_4_ + iVar88 + auVar99._0_4_ >> auVar100;
  local_228._8_4_ = auVar95._8_4_ + iVar88 + auVar99._8_4_ >> auVar100;
  local_228._12_4_ = auVar95._12_4_ + iVar88 + auVar99._12_4_ >> auVar100;
  local_218._4_4_ = auVar103._4_4_ + iVar88 + auVar102._4_4_ >> auVar100;
  local_218._0_4_ = auVar103._0_4_ + iVar88 + auVar102._0_4_ >> auVar100;
  local_218._8_4_ = auVar103._8_4_ + iVar88 + auVar102._8_4_ >> auVar100;
  local_218._12_4_ = auVar103._12_4_ + iVar88 + auVar102._12_4_ >> auVar100;
  local_208 = auVar106._0_4_ + iVar88 + auVar105._0_4_ >> auVar100;
  iStack_204 = auVar106._4_4_ + iVar88 + auVar105._4_4_ >> auVar100;
  iStack_200 = auVar106._8_4_ + iVar88 + auVar105._8_4_ >> auVar100;
  iStack_1fc = auVar106._12_4_ + iVar88 + auVar105._12_4_ >> auVar100;
  auVar38._4_4_ = iStack_1b4;
  auVar38._0_4_ = local_1b8;
  auVar38._8_4_ = iStack_1b0;
  auVar38._12_4_ = iStack_1ac;
  auVar56._4_4_ = iStack_104;
  auVar56._0_4_ = local_108;
  auVar56._8_4_ = iStack_100;
  auVar56._12_4_ = iStack_fc;
  auVar99 = pmulld(auVar38,auVar121);
  auVar94 = pmulld(auVar56,auVar142);
  auVar41._4_4_ = iStack_1a4;
  auVar41._0_4_ = local_1a8;
  auVar41._8_4_ = iStack_1a0;
  auVar41._12_4_ = iStack_19c;
  auVar53._4_4_ = iStack_114;
  auVar53._0_4_ = local_118;
  auVar53._8_4_ = iStack_110;
  auVar53._12_4_ = iStack_10c;
  auVar95 = pmulld(auVar41,auVar121);
  auVar96 = pmulld(auVar53,auVar142);
  auVar51._4_4_ = iStack_124;
  auVar51._0_4_ = local_128;
  auVar51._8_4_ = iStack_120;
  auVar51._12_4_ = iStack_11c;
  auVar105 = pmulld(local_198,auVar153);
  auVar97 = pmulld(auVar51,auVar121);
  auVar44._4_4_ = iStack_184;
  auVar44._0_4_ = local_188;
  auVar44._8_4_ = iStack_180;
  auVar44._12_4_ = iStack_17c;
  auVar159 = pmulld(auVar153,auVar44);
  auVar49._4_4_ = iStack_134;
  auVar49._0_4_ = local_138;
  auVar49._8_4_ = iStack_130;
  auVar49._12_4_ = iStack_12c;
  auVar106 = pmulld(auVar49,auVar121);
  auVar98 = pmulld(auVar44,auVar121);
  auVar102 = pmulld(auVar49,auVar142);
  local_138 = auVar98._0_4_ + iVar88 + auVar102._0_4_ >> auVar100;
  iStack_134 = auVar98._4_4_ + iVar88 + auVar102._4_4_ >> auVar100;
  iStack_130 = auVar98._8_4_ + iVar88 + auVar102._8_4_ >> auVar100;
  iStack_12c = auVar98._12_4_ + iVar88 + auVar102._12_4_ >> auVar100;
  auVar98 = pmulld(local_198,auVar121);
  auVar115._4_4_ = iVar84;
  auVar115._0_4_ = iVar84;
  auVar115._8_4_ = iVar84;
  auVar115._12_4_ = iVar84;
  auVar102 = pmulld(auVar51,auVar142);
  local_128 = auVar98._0_4_ + iVar88 + auVar102._0_4_ >> auVar100;
  iStack_124 = auVar98._4_4_ + iVar88 + auVar102._4_4_ >> auVar100;
  iStack_120 = auVar98._8_4_ + iVar88 + auVar102._8_4_ >> auVar100;
  iStack_11c = auVar98._12_4_ + iVar88 + auVar102._12_4_ >> auVar100;
  auVar104 = pmulld(auVar41,auVar142);
  auVar98 = pmulld(auVar53,auVar131);
  auVar103 = pmulld(auVar38,auVar142);
  auVar102 = pmulld(auVar56,auVar131);
  local_118 = auVar104._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_114 = auVar104._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_110 = auVar104._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_10c = auVar104._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  local_108 = auVar103._0_4_ + iVar88 + auVar102._0_4_ >> auVar100;
  iStack_104 = auVar103._4_4_ + iVar88 + auVar102._4_4_ >> auVar100;
  iStack_100 = auVar103._8_4_ + iVar88 + auVar102._8_4_ >> auVar100;
  iStack_fc = auVar103._12_4_ + iVar88 + auVar102._12_4_ >> auVar100;
  local_1b8 = auVar99._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  iStack_1b4 = auVar99._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  iStack_1b0 = auVar99._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  iStack_1ac = auVar99._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_1a8 = auVar95._0_4_ + iVar88 + auVar96._0_4_ >> auVar100;
  iStack_1a4 = auVar95._4_4_ + iVar88 + auVar96._4_4_ >> auVar100;
  iStack_1a0 = auVar95._8_4_ + iVar88 + auVar96._8_4_ >> auVar100;
  iStack_19c = auVar95._12_4_ + iVar88 + auVar96._12_4_ >> auVar100;
  local_198._4_4_ = auVar105._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  local_198._0_4_ = auVar105._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  local_198._8_4_ = auVar105._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  local_198._12_4_ = auVar105._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  local_188 = auVar159._0_4_ + iVar88 + auVar106._0_4_ >> auVar100;
  iStack_184 = auVar159._4_4_ + iVar88 + auVar106._4_4_ >> auVar100;
  iStack_180 = auVar159._8_4_ + iVar88 + auVar106._8_4_ >> auVar100;
  iStack_17c = auVar159._12_4_ + iVar88 + auVar106._12_4_ >> auVar100;
  local_428 = local_568._0_8_;
  uStack_420 = local_568._8_8_;
  local_438 = CONCAT44(local_458[5],local_458[4]);
  uStack_430 = CONCAT44(local_458[7],local_458[6]);
  auVar4._4_4_ = iStack_414;
  auVar4._0_4_ = local_418;
  auVar4._8_4_ = iStack_410;
  auVar4._12_4_ = iStack_40c;
  auVar5._4_4_ = local_3e8[1];
  auVar5._0_4_ = local_3e8[0];
  auVar5._8_4_ = local_3e8[2];
  auVar5._12_4_ = local_3e8[3];
  auVar112._0_4_ = local_3e8[0] + local_418;
  auVar112._4_4_ = local_3e8[1] + iStack_414;
  auVar112._8_4_ = local_3e8[2] + iStack_410;
  auVar112._12_4_ = local_3e8[3] + iStack_40c;
  auVar159 = pmulld(auVar4,auVar115);
  auVar95 = pmulld(auVar5,auVar111);
  auVar94 = pmulld(auVar112,auVar111);
  local_3f8 = auVar94._0_4_ + iVar88 >> auVar100;
  iStack_3f4 = auVar94._4_4_ + iVar88 >> auVar100;
  iStack_3f0 = auVar94._8_4_ + iVar88 >> auVar100;
  iStack_3ec = auVar94._12_4_ + iVar88 >> auVar100;
  local_408 = auVar159._0_4_ + iVar88 + auVar95._0_4_ >> auVar100;
  iStack_404 = auVar159._4_4_ + iVar88 + auVar95._4_4_ >> auVar100;
  iStack_400 = auVar159._8_4_ + iVar88 + auVar95._8_4_ >> auVar100;
  iStack_3fc = auVar159._12_4_ + iVar88 + auVar95._12_4_ >> auVar100;
  iVar79 = local_3a8 + local_3e8[4];
  iVar84 = uStack_3a4 + local_3e8[5];
  iVar128 = uStack_3a0 + local_3e8[6];
  iVar134 = uStack_39c + uStack_3cc;
  iVar91 = local_3e8[4] - local_3a8;
  iVar89 = local_3e8[5] - uStack_3a4;
  iVar82 = local_3e8[6] - uStack_3a0;
  iVar90 = uStack_3cc - uStack_39c;
  uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
  uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
  uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
  uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
  uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
  uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
  uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
  uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
  local_3e8[4] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
  local_3e8[5] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
  local_3e8[6] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
  uStack_3cc = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
  local_3a8 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
  uStack_3a4 = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
  uStack_3a0 = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
  uStack_39c = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
  iVar79 = local_3b8 + local_3c8;
  iVar84 = uStack_3b4 + uStack_3c4;
  iVar128 = uStack_3b0 + uStack_3c0;
  iVar134 = uStack_3ac + uStack_3bc;
  iVar91 = local_3c8 - local_3b8;
  iVar89 = uStack_3c4 - uStack_3b4;
  iVar82 = uStack_3c0 - uStack_3b0;
  iVar90 = uStack_3bc - uStack_3ac;
  uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
  uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
  uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
  uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
  uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
  uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
  uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
  uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
  local_3c8 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
  uStack_3c4 = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
  uStack_3c0 = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
  uStack_3bc = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
  local_3b8 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
  uStack_3b4 = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
  uStack_3b0 = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
  uStack_3ac = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
  iVar79 = local_398 + local_368[0];
  iVar84 = uStack_394 + local_368[1];
  iVar128 = uStack_390 + local_368[2];
  iVar134 = uStack_38c + local_368[3];
  iVar91 = local_368[0] - local_398;
  iVar89 = local_368[1] - uStack_394;
  iVar82 = local_368[2] - uStack_390;
  iVar90 = local_368[3] - uStack_38c;
  uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
  uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
  uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
  uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
  uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
  uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
  uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
  uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
  local_368[0] = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
  local_368[1] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
  local_368[2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
  local_368[3] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
  local_398 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
  uStack_394 = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
  uStack_390 = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
  uStack_38c = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
  iVar79 = local_388 + local_378;
  iVar84 = uStack_384 + uStack_374;
  iVar128 = uStack_380 + uStack_370;
  iVar134 = uStack_37c + uStack_36c;
  iVar91 = local_378 - local_388;
  iVar89 = uStack_374 - uStack_384;
  iVar82 = uStack_370 - uStack_380;
  iVar90 = uStack_36c - uStack_37c;
  uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
  uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
  uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
  uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
  uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
  uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
  uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
  uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
  local_378 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
  uStack_374 = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
  uStack_370 = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
  uStack_36c = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
  local_388 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
  uStack_384 = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
  uStack_380 = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
  uStack_37c = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
  auVar29._4_4_ = iStack_284;
  auVar29._0_4_ = local_288;
  auVar29._8_4_ = iStack_280;
  auVar29._12_4_ = iStack_27c;
  auVar14._4_4_ = iStack_334;
  auVar14._0_4_ = local_338;
  auVar14._8_4_ = iStack_330;
  auVar14._12_4_ = iStack_32c;
  auVar15._4_4_ = iStack_324;
  auVar15._0_4_ = local_328;
  auVar15._8_4_ = iStack_320;
  auVar15._12_4_ = iStack_31c;
  auVar16._4_4_ = iStack_314;
  auVar16._0_4_ = local_318;
  auVar16._8_4_ = iStack_310;
  auVar16._12_4_ = iStack_30c;
  auVar18._4_4_ = iStack_304;
  auVar18._0_4_ = local_308;
  auVar18._8_4_ = iStack_300;
  auVar18._12_4_ = iStack_2fc;
  auVar102 = pmulld(auVar14,auVar148);
  auVar94 = pmulld(auVar29,auVar101);
  auVar28._4_4_ = iStack_294;
  auVar28._0_4_ = local_298;
  auVar28._8_4_ = iStack_290;
  auVar28._12_4_ = iStack_28c;
  auVar95 = pmulld(auVar15,auVar148);
  auVar98 = pmulld(auVar28,auVar101);
  auVar26._4_4_ = iStack_2a4;
  auVar26._0_4_ = local_2a8;
  auVar26._8_4_ = iStack_2a0;
  auVar26._12_4_ = iStack_29c;
  auVar103 = pmulld(auVar16,auVar132);
  auVar99 = pmulld(auVar26,auVar148);
  auVar24._4_4_ = iStack_2b4;
  auVar24._0_4_ = local_2b8;
  auVar24._8_4_ = iStack_2b0;
  auVar24._12_4_ = iStack_2ac;
  auVar97 = pmulld(auVar18,auVar148);
  auVar159 = pmulld(auVar24,auVar101);
  auVar104 = pmulld(auVar18,auVar132);
  auVar96 = pmulld(auVar24,auVar148);
  local_2b8 = auVar97._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  iStack_2b4 = auVar97._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  iStack_2b0 = auVar97._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  iStack_2ac = auVar97._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  auVar159 = pmulld(auVar16,auVar148);
  auVar97 = pmulld(auVar26,auVar101);
  local_2a8 = auVar159._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  iStack_2a4 = auVar159._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  iStack_2a0 = auVar159._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  iStack_29c = auVar159._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  auVar97 = pmulld(auVar15,auVar101);
  auVar159 = pmulld(auVar28,auVar156);
  local_298 = auVar97._0_4_ + iVar88 + auVar159._0_4_ >> auVar100;
  iStack_294 = auVar97._4_4_ + iVar88 + auVar159._4_4_ >> auVar100;
  iStack_290 = auVar97._8_4_ + iVar88 + auVar159._8_4_ >> auVar100;
  iStack_28c = auVar97._12_4_ + iVar88 + auVar159._12_4_ >> auVar100;
  auVar159 = pmulld(auVar14,auVar101);
  auVar97 = pmulld(auVar29,auVar156);
  local_288 = auVar159._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  iStack_284 = auVar159._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  iStack_280 = auVar159._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  iStack_27c = auVar159._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  local_338 = auVar102._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  iStack_334 = auVar102._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  iStack_330 = auVar102._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  iStack_32c = auVar102._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_328 = auVar95._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_324 = auVar95._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_320 = auVar95._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_31c = auVar95._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  local_318 = auVar103._0_4_ + iVar88 + auVar99._0_4_ >> auVar100;
  iStack_314 = auVar103._4_4_ + iVar88 + auVar99._4_4_ >> auVar100;
  iStack_310 = auVar103._8_4_ + iVar88 + auVar99._8_4_ >> auVar100;
  iStack_30c = auVar103._12_4_ + iVar88 + auVar99._12_4_ >> auVar100;
  local_308 = auVar104._0_4_ + iVar88 + auVar96._0_4_ >> auVar100;
  iStack_304 = auVar104._4_4_ + iVar88 + auVar96._4_4_ >> auVar100;
  iStack_300 = auVar104._8_4_ + iVar88 + auVar96._8_4_ >> auVar100;
  iStack_2fc = auVar104._12_4_ + iVar88 + auVar96._12_4_ >> auVar100;
  uVar76 = 0x20;
  do {
    lVar80 = 0;
    uVar85 = uVar76;
    do {
      piVar1 = (int *)(puVar77 + lVar80);
      uVar86 = uVar85 ^ 7;
      iVar79 = local_458[uVar86 * 4] + *piVar1;
      iVar84 = local_458[uVar86 * 4 + 1] + piVar1[1];
      iVar128 = local_458[uVar86 * 4 + 2] + piVar1[2];
      iVar134 = local_458[uVar86 * 4 + 3] + piVar1[3];
      iVar91 = *piVar1 - local_458[uVar86 * 4];
      iVar89 = piVar1[1] - local_458[uVar86 * 4 + 1];
      iVar82 = piVar1[2] - local_458[uVar86 * 4 + 2];
      iVar90 = piVar1[3] - local_458[uVar86 * 4 + 3];
      uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
      uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
      uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
      uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
      uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
      uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
      uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
      uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
      puVar78 = (uint *)(puVar77 + lVar80);
      *puVar78 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
      puVar78[1] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
      puVar78[2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
      puVar78[3] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
      local_458[uVar86 * 4] =
           (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
      local_458[uVar86 * 4 + 1] =
           (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
      local_458[uVar86 * 4 + 2] =
           (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
      local_458[uVar86 * 4 + 3] =
           (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
      uVar86 = uVar85 ^ 0xf;
      uVar87 = uVar85 ^ 8;
      iVar79 = local_458[uVar87 * 4] + local_458[uVar86 * 4];
      iVar84 = local_458[uVar87 * 4 + 1] + local_458[uVar86 * 4 + 1];
      iVar128 = local_458[uVar87 * 4 + 2] + local_458[uVar86 * 4 + 2];
      iVar134 = local_458[uVar87 * 4 + 3] + local_458[uVar86 * 4 + 3];
      iVar91 = local_458[uVar86 * 4] - local_458[uVar87 * 4];
      iVar89 = local_458[uVar86 * 4 + 1] - local_458[uVar87 * 4 + 1];
      iVar82 = local_458[uVar86 * 4 + 2] - local_458[uVar87 * 4 + 2];
      iVar90 = local_458[uVar86 * 4 + 3] - local_458[uVar87 * 4 + 3];
      uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
      uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
      uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
      uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
      uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
      uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
      uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
      uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
      local_458[uVar86 * 4] =
           (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
      local_458[uVar86 * 4 + 1] =
           (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
      local_458[uVar86 * 4 + 2] =
           (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
      local_458[uVar86 * 4 + 3] =
           (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
      local_458[uVar87 * 4] =
           (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
      local_458[uVar87 * 4 + 1] =
           (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
      local_458[uVar87 * 4 + 2] =
           (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
      local_458[uVar87 * 4 + 3] =
           (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
      uVar85 = uVar85 + 1;
      lVar80 = lVar80 + 0x10;
    } while (lVar80 != 0x40);
    puVar77 = puVar77 + 0x100;
    uVar129 = (uint)uVar76;
    uVar76 = uVar76 + 0x10;
  } while (uVar129 < 0x30);
  puVar78 = local_3e8;
  lVar80 = 0;
  do {
    iVar91 = *(int *)((long)local_458 + lVar80 + 4);
    iVar89 = *(int *)((long)local_458 + lVar80 + 8);
    iVar82 = *(int *)((long)local_458 + lVar80 + 0xc);
    iVar79 = *puVar78 + *(int *)((long)local_458 + lVar80);
    iVar84 = puVar78[1] + iVar91;
    iVar128 = puVar78[2] + iVar89;
    iVar134 = puVar78[3] + iVar82;
    iVar90 = *(int *)((long)local_458 + lVar80) - *puVar78;
    iVar91 = iVar91 - puVar78[1];
    iVar89 = iVar89 - puVar78[2];
    iVar82 = iVar82 - puVar78[3];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar129 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    uVar135 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar137 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar139 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    *(uint *)((long)local_458 + lVar80) =
         (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    *(uint *)((long)local_458 + lVar80 + 4) =
         (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    *(uint *)((long)local_458 + lVar80 + 8) =
         (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    *(uint *)((long)local_458 + lVar80 + 0xc) =
         (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    *puVar78 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[1] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[2] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[3] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    puVar78 = puVar78 + -4;
    lVar80 = lVar80 + 0x10;
  } while (lVar80 != 0x40);
  puVar78 = local_368;
  auVar8._4_4_ = uStack_3b4;
  auVar8._0_4_ = local_3b8;
  auVar8._8_4_ = uStack_3b0;
  auVar8._12_4_ = uStack_3ac;
  auVar9._4_4_ = uStack_3a4;
  auVar9._0_4_ = local_3a8;
  auVar9._8_4_ = uStack_3a0;
  auVar9._12_4_ = uStack_39c;
  auVar10._4_4_ = uStack_394;
  auVar10._0_4_ = local_398;
  auVar10._8_4_ = uStack_390;
  auVar10._12_4_ = uStack_38c;
  auVar12._4_4_ = uStack_384;
  auVar12._0_4_ = local_388;
  auVar12._8_4_ = uStack_380;
  auVar12._12_4_ = uStack_37c;
  auVar116._0_4_ = local_388 + local_3b8;
  auVar116._4_4_ = uStack_384 + uStack_3b4;
  auVar116._8_4_ = uStack_380 + uStack_3b0;
  auVar116._12_4_ = uStack_37c + uStack_3ac;
  auVar96 = pmulld(auVar8,auVar115);
  auVar97 = pmulld(auVar12,auVar111);
  auVar159 = pmulld(auVar116,auVar111);
  local_388 = auVar159._0_4_ + iVar88 >> auVar100;
  uStack_384 = auVar159._4_4_ + iVar88 >> auVar100;
  uStack_380 = auVar159._8_4_ + iVar88 >> auVar100;
  uStack_37c = auVar159._12_4_ + iVar88 >> auVar100;
  auVar92._0_4_ = local_398 + local_3a8;
  auVar92._4_4_ = uStack_394 + uStack_3a4;
  auVar92._8_4_ = uStack_390 + uStack_3a0;
  auVar92._12_4_ = uStack_38c + uStack_39c;
  auVar94 = pmulld(auVar9,auVar115);
  auVar95 = pmulld(auVar10,auVar111);
  auVar159 = pmulld(auVar92,auVar111);
  local_3b8 = auVar96._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  uStack_3b4 = auVar96._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  uStack_3b0 = auVar96._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  uStack_3ac = auVar96._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  local_398 = auVar159._0_4_ + iVar88 >> auVar100;
  uStack_394 = auVar159._4_4_ + iVar88 >> auVar100;
  uStack_390 = auVar159._8_4_ + iVar88 >> auVar100;
  uStack_38c = auVar159._12_4_ + iVar88 >> auVar100;
  local_3a8 = auVar94._0_4_ + iVar88 + auVar95._0_4_ >> auVar100;
  uStack_3a4 = auVar94._4_4_ + iVar88 + auVar95._4_4_ >> auVar100;
  uStack_3a0 = auVar94._8_4_ + iVar88 + auVar95._8_4_ >> auVar100;
  uStack_39c = auVar94._12_4_ + iVar88 + auVar95._12_4_ >> auVar100;
  uVar76 = 0x10;
  do {
    puVar78 = puVar78 + 4;
    uVar85 = uVar76 ^ 7;
    iVar79 = local_458[uVar85 * 4] + *puVar78;
    iVar84 = local_458[uVar85 * 4 + 1] + puVar78[1];
    iVar128 = local_458[uVar85 * 4 + 2] + puVar78[2];
    iVar134 = local_458[uVar85 * 4 + 3] + puVar78[3];
    iVar91 = *puVar78 - local_458[uVar85 * 4];
    iVar89 = puVar78[1] - local_458[uVar85 * 4 + 1];
    iVar82 = puVar78[2] - local_458[uVar85 * 4 + 2];
    iVar90 = puVar78[3] - local_458[uVar85 * 4 + 3];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    *puVar78 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[1] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[3] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    local_458[uVar85 * 4] =
         (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    local_458[uVar85 * 4 + 1] =
         (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    local_458[uVar85 * 4 + 2] =
         (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    local_458[uVar85 * 4 + 3] =
         (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    uVar85 = uVar76 ^ 0xf;
    uVar86 = uVar76 ^ 8;
    iVar79 = local_458[uVar86 * 4] + local_458[uVar85 * 4];
    iVar84 = local_458[uVar86 * 4 + 1] + local_458[uVar85 * 4 + 1];
    iVar128 = local_458[uVar86 * 4 + 2] + local_458[uVar85 * 4 + 2];
    iVar134 = local_458[uVar86 * 4 + 3] + local_458[uVar85 * 4 + 3];
    iVar91 = local_458[uVar85 * 4] - local_458[uVar86 * 4];
    iVar89 = local_458[uVar85 * 4 + 1] - local_458[uVar86 * 4 + 1];
    iVar82 = local_458[uVar85 * 4 + 2] - local_458[uVar86 * 4 + 2];
    iVar90 = local_458[uVar85 * 4 + 3] - local_458[uVar86 * 4 + 3];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    local_458[uVar85 * 4] =
         (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    local_458[uVar85 * 4 + 1] =
         (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    local_458[uVar85 * 4 + 2] =
         (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    local_458[uVar85 * 4 + 3] =
         (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    local_458[uVar86 * 4] =
         (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    local_458[uVar86 * 4 + 1] =
         (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    local_458[uVar86 * 4 + 2] =
         (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    local_458[uVar86 * 4 + 3] =
         (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    uVar76 = uVar76 + 1;
  } while (uVar76 != 0x14);
  puVar78 = local_368;
  auVar32._4_4_ = iStack_204;
  auVar32._0_4_ = local_208;
  auVar32._8_4_ = iStack_200;
  auVar32._12_4_ = iStack_1fc;
  auVar33._4_4_ = iStack_1f4;
  auVar33._0_4_ = local_1f8;
  auVar33._8_4_ = iStack_1f0;
  auVar33._12_4_ = iStack_1ec;
  auVar159 = pmulld(local_218,auVar148);
  auVar95 = pmulld(local_a8,auVar101);
  auVar65._4_4_ = iStack_b4;
  auVar65._0_4_ = local_b8;
  auVar65._8_4_ = iStack_b0;
  auVar65._12_4_ = iStack_ac;
  auVar102 = pmulld(auVar32,auVar148);
  auVar96 = pmulld(auVar65,auVar101);
  auVar63._4_4_ = iStack_c4;
  auVar63._0_4_ = local_c8;
  auVar63._8_4_ = iStack_c0;
  auVar63._12_4_ = iStack_bc;
  auVar103 = pmulld(auVar33,auVar148);
  auVar97 = pmulld(auVar63,auVar101);
  auVar105 = pmulld(local_1e8,auVar148);
  auVar99 = pmulld(local_d8,auVar101);
  auVar98 = pmulld(local_1e8,auVar101);
  auVar94 = pmulld(local_d8,auVar156);
  auVar104 = pmulld(auVar33,auVar101);
  auVar106 = pmulld(auVar63,auVar156);
  local_d8._4_4_ = auVar98._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  local_d8._0_4_ = auVar98._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  local_d8._8_4_ = auVar98._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  local_d8._12_4_ = auVar98._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_c8 = auVar104._0_4_ + iVar88 + auVar106._0_4_ >> auVar100;
  iStack_c4 = auVar104._4_4_ + iVar88 + auVar106._4_4_ >> auVar100;
  iStack_c0 = auVar104._8_4_ + iVar88 + auVar106._8_4_ >> auVar100;
  iStack_bc = auVar104._12_4_ + iVar88 + auVar106._12_4_ >> auVar100;
  auVar94 = pmulld(auVar32,auVar101);
  auVar98 = pmulld(auVar65,auVar156);
  local_b8 = auVar94._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_b4 = auVar94._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_b0 = auVar94._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_ac = auVar94._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  auVar98 = pmulld(local_218,auVar101);
  auVar94 = pmulld(local_a8,auVar156);
  local_a8._4_4_ = auVar98._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  local_a8._0_4_ = auVar98._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  local_a8._8_4_ = auVar98._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  local_a8._12_4_ = auVar98._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_218._4_4_ = auVar159._4_4_ + iVar88 + auVar95._4_4_ >> auVar100;
  local_218._0_4_ = auVar159._0_4_ + iVar88 + auVar95._0_4_ >> auVar100;
  local_218._8_4_ = auVar159._8_4_ + iVar88 + auVar95._8_4_ >> auVar100;
  local_218._12_4_ = auVar159._12_4_ + iVar88 + auVar95._12_4_ >> auVar100;
  local_208 = auVar102._0_4_ + iVar88 + auVar96._0_4_ >> auVar100;
  iStack_204 = auVar102._4_4_ + iVar88 + auVar96._4_4_ >> auVar100;
  iStack_200 = auVar102._8_4_ + iVar88 + auVar96._8_4_ >> auVar100;
  iStack_1fc = auVar102._12_4_ + iVar88 + auVar96._12_4_ >> auVar100;
  local_1f8 = auVar103._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  iStack_1f4 = auVar103._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  iStack_1f0 = auVar103._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  iStack_1ec = auVar103._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  local_1e8._4_4_ = auVar105._4_4_ + iVar88 + auVar99._4_4_ >> auVar100;
  local_1e8._0_4_ = auVar105._0_4_ + iVar88 + auVar99._0_4_ >> auVar100;
  local_1e8._8_4_ = auVar105._8_4_ + iVar88 + auVar99._8_4_ >> auVar100;
  local_1e8._12_4_ = auVar105._12_4_ + iVar88 + auVar99._12_4_ >> auVar100;
  auVar34._4_4_ = iStack_1d4;
  auVar34._0_4_ = local_1d8;
  auVar34._8_4_ = iStack_1d0;
  auVar34._12_4_ = iStack_1cc;
  auVar61._4_4_ = iStack_e4;
  auVar61._0_4_ = local_e8;
  auVar61._8_4_ = iStack_e0;
  auVar61._12_4_ = iStack_dc;
  auVar102 = pmulld(auVar34,auVar132);
  auVar94 = pmulld(auVar61,auVar148);
  auVar36._4_4_ = iStack_1c4;
  auVar36._0_4_ = local_1c8;
  auVar36._8_4_ = iStack_1c0;
  auVar36._12_4_ = iStack_1bc;
  auVar59._4_4_ = iStack_f4;
  auVar59._0_4_ = local_f8;
  auVar59._8_4_ = iStack_f0;
  auVar59._12_4_ = iStack_ec;
  auVar95 = pmulld(auVar36,auVar132);
  auVar96 = pmulld(auVar59,auVar148);
  auVar39._4_4_ = iStack_1b4;
  auVar39._0_4_ = local_1b8;
  auVar39._8_4_ = iStack_1b0;
  auVar39._12_4_ = iStack_1ac;
  auVar57._4_4_ = iStack_104;
  auVar57._0_4_ = local_108;
  auVar57._8_4_ = iStack_100;
  auVar57._12_4_ = iStack_fc;
  auVar103 = pmulld(auVar39,auVar132);
  auVar97 = pmulld(auVar57,auVar148);
  auVar42._4_4_ = iStack_1a4;
  auVar42._0_4_ = local_1a8;
  auVar42._8_4_ = iStack_1a0;
  auVar42._12_4_ = iStack_19c;
  auVar54._4_4_ = iStack_114;
  auVar54._0_4_ = local_118;
  auVar54._8_4_ = iStack_110;
  auVar54._12_4_ = iStack_10c;
  auVar159 = pmulld(auVar132,auVar42);
  auVar98 = pmulld(auVar42,auVar148);
  auVar99 = pmulld(auVar54,auVar101);
  auVar104 = pmulld(auVar54,auVar148);
  local_118 = auVar98._0_4_ + iVar88 + auVar99._0_4_ >> auVar100;
  iStack_114 = auVar98._4_4_ + iVar88 + auVar99._4_4_ >> auVar100;
  iStack_110 = auVar98._8_4_ + iVar88 + auVar99._8_4_ >> auVar100;
  iStack_10c = auVar98._12_4_ + iVar88 + auVar99._12_4_ >> auVar100;
  auVar98 = pmulld(auVar39,auVar148);
  auVar99 = pmulld(auVar57,auVar101);
  local_108 = auVar98._0_4_ + iVar88 + auVar99._0_4_ >> auVar100;
  iStack_104 = auVar98._4_4_ + iVar88 + auVar99._4_4_ >> auVar100;
  iStack_100 = auVar98._8_4_ + iVar88 + auVar99._8_4_ >> auVar100;
  iStack_fc = auVar98._12_4_ + iVar88 + auVar99._12_4_ >> auVar100;
  auVar99 = pmulld(auVar36,auVar148);
  auVar98 = pmulld(auVar59,auVar101);
  local_f8 = auVar99._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_f4 = auVar99._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_f0 = auVar99._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_ec = auVar99._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  auVar99 = pmulld(auVar34,auVar148);
  auVar98 = pmulld(auVar61,auVar101);
  local_e8 = auVar99._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_e4 = auVar99._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_e0 = auVar99._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_dc = auVar99._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  local_1d8 = auVar102._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  iStack_1d4 = auVar102._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  iStack_1d0 = auVar102._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  iStack_1cc = auVar102._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_1c8 = auVar95._0_4_ + iVar88 + auVar96._0_4_ >> auVar100;
  iStack_1c4 = auVar95._4_4_ + iVar88 + auVar96._4_4_ >> auVar100;
  iStack_1c0 = auVar95._8_4_ + iVar88 + auVar96._8_4_ >> auVar100;
  iStack_1bc = auVar95._12_4_ + iVar88 + auVar96._12_4_ >> auVar100;
  local_1b8 = auVar103._0_4_ + iVar88 + auVar97._0_4_ >> auVar100;
  iStack_1b4 = auVar103._4_4_ + iVar88 + auVar97._4_4_ >> auVar100;
  iStack_1b0 = auVar103._8_4_ + iVar88 + auVar97._8_4_ >> auVar100;
  iStack_1ac = auVar103._12_4_ + iVar88 + auVar97._12_4_ >> auVar100;
  local_1a8 = auVar159._0_4_ + iVar88 + auVar104._0_4_ >> auVar100;
  iStack_1a4 = auVar159._4_4_ + iVar88 + auVar104._4_4_ >> auVar100;
  iStack_1a0 = auVar159._8_4_ + iVar88 + auVar104._8_4_ >> auVar100;
  iStack_19c = auVar159._12_4_ + iVar88 + auVar104._12_4_ >> auVar100;
  lVar80 = 0;
  do {
    iVar91 = *(int *)((long)local_458 + lVar80 + 4);
    iVar89 = *(int *)((long)local_458 + lVar80 + 8);
    iVar82 = *(int *)((long)local_458 + lVar80 + 0xc);
    iVar79 = *puVar78 + *(int *)((long)local_458 + lVar80);
    iVar84 = puVar78[1] + iVar91;
    iVar128 = puVar78[2] + iVar89;
    iVar134 = puVar78[3] + iVar82;
    iVar90 = *(int *)((long)local_458 + lVar80) - *puVar78;
    iVar91 = iVar91 - puVar78[1];
    iVar89 = iVar89 - puVar78[2];
    iVar82 = iVar82 - puVar78[3];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar129 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    uVar135 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar137 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar139 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    *(uint *)((long)local_458 + lVar80) =
         (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    *(uint *)((long)local_458 + lVar80 + 4) =
         (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    *(uint *)((long)local_458 + lVar80 + 8) =
         (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    *(uint *)((long)local_458 + lVar80 + 0xc) =
         (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    *puVar78 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[1] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[2] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[3] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    lVar80 = lVar80 + 0x10;
    puVar78 = puVar78 + -4;
  } while (lVar80 != 0x80);
  puVar78 = (uint *)local_258;
  auVar27._4_4_ = iStack_2a4;
  auVar27._0_4_ = local_2a8;
  auVar27._8_4_ = iStack_2a0;
  auVar27._12_4_ = iStack_29c;
  auVar17._4_4_ = iStack_314;
  auVar17._0_4_ = local_318;
  auVar17._8_4_ = iStack_310;
  auVar17._12_4_ = iStack_30c;
  auVar19._4_4_ = iStack_304;
  auVar19._0_4_ = local_308;
  auVar19._8_4_ = iStack_300;
  auVar19._12_4_ = iStack_2fc;
  auVar20._4_4_ = iStack_2f4;
  auVar20._0_4_ = local_2f8;
  auVar20._8_4_ = iStack_2f0;
  auVar20._12_4_ = iStack_2ec;
  auVar21._4_4_ = iStack_2e4;
  auVar21._0_4_ = local_2e8;
  auVar21._8_4_ = iStack_2e0;
  auVar21._12_4_ = iStack_2dc;
  auVar93._0_4_ = local_2a8 + local_318;
  auVar93._4_4_ = iStack_2a4 + iStack_314;
  auVar93._8_4_ = iStack_2a0 + iStack_310;
  auVar93._12_4_ = iStack_29c + iStack_30c;
  auVar98 = pmulld(auVar17,auVar115);
  auVar99 = pmulld(auVar27,auVar111);
  auVar25._4_4_ = iStack_2b4;
  auVar25._0_4_ = local_2b8;
  auVar25._8_4_ = iStack_2b0;
  auVar25._12_4_ = iStack_2ac;
  auVar143._0_4_ = local_2b8 + local_308;
  auVar143._4_4_ = iStack_2b4 + iStack_304;
  auVar143._8_4_ = iStack_2b0 + iStack_300;
  auVar143._12_4_ = iStack_2ac + iStack_2fc;
  auVar94 = pmulld(auVar19,auVar115);
  auVar95 = pmulld(auVar25,auVar111);
  auVar23._4_4_ = iStack_2c4;
  auVar23._0_4_ = local_2c8;
  auVar23._8_4_ = iStack_2c0;
  auVar23._12_4_ = iStack_2bc;
  auVar117._0_4_ = local_2c8 + local_2f8;
  auVar117._4_4_ = iStack_2c4 + iStack_2f4;
  auVar117._8_4_ = iStack_2c0 + iStack_2f0;
  auVar117._12_4_ = iStack_2bc + iStack_2ec;
  auVar97 = pmulld(auVar20,auVar115);
  auVar103 = pmulld(auVar23,auVar111);
  auVar22._4_4_ = iStack_2d4;
  auVar22._0_4_ = local_2d8;
  auVar22._8_4_ = iStack_2d0;
  auVar22._12_4_ = iStack_2cc;
  auVar149._0_4_ = local_2d8 + local_2e8;
  auVar149._4_4_ = iStack_2d4 + iStack_2e4;
  auVar149._8_4_ = iStack_2d0 + iStack_2e0;
  auVar149._12_4_ = iStack_2cc + iStack_2dc;
  auVar96 = pmulld(auVar21,auVar115);
  auVar104 = pmulld(auVar22,auVar111);
  auVar159 = pmulld(auVar149,auVar111);
  local_2d8 = auVar159._0_4_ + iVar88 >> auVar100;
  iStack_2d4 = auVar159._4_4_ + iVar88 >> auVar100;
  iStack_2d0 = auVar159._8_4_ + iVar88 >> auVar100;
  iStack_2cc = auVar159._12_4_ + iVar88 >> auVar100;
  auVar159 = pmulld(auVar117,auVar111);
  auVar102 = pmulld(auVar143,auVar111);
  local_2c8 = auVar159._0_4_ + iVar88 >> auVar100;
  iStack_2c4 = auVar159._4_4_ + iVar88 >> auVar100;
  iStack_2c0 = auVar159._8_4_ + iVar88 >> auVar100;
  iStack_2bc = auVar159._12_4_ + iVar88 >> auVar100;
  local_2b8 = auVar102._0_4_ + iVar88 >> auVar100;
  iStack_2b4 = auVar102._4_4_ + iVar88 >> auVar100;
  iStack_2b0 = auVar102._8_4_ + iVar88 >> auVar100;
  iStack_2ac = auVar102._12_4_ + iVar88 >> auVar100;
  auVar159 = pmulld(auVar93,auVar111);
  local_2a8 = auVar159._0_4_ + iVar88 >> auVar100;
  iStack_2a4 = auVar159._4_4_ + iVar88 >> auVar100;
  iStack_2a0 = auVar159._8_4_ + iVar88 >> auVar100;
  iStack_29c = auVar159._12_4_ + iVar88 >> auVar100;
  local_318 = auVar98._0_4_ + iVar88 + auVar99._0_4_ >> auVar100;
  iStack_314 = auVar98._4_4_ + iVar88 + auVar99._4_4_ >> auVar100;
  iStack_310 = auVar98._8_4_ + iVar88 + auVar99._8_4_ >> auVar100;
  iStack_30c = auVar98._12_4_ + iVar88 + auVar99._12_4_ >> auVar100;
  local_308 = auVar94._0_4_ + iVar88 + auVar95._0_4_ >> auVar100;
  iStack_304 = auVar94._4_4_ + iVar88 + auVar95._4_4_ >> auVar100;
  iStack_300 = auVar94._8_4_ + iVar88 + auVar95._8_4_ >> auVar100;
  iStack_2fc = auVar94._12_4_ + iVar88 + auVar95._12_4_ >> auVar100;
  local_2f8 = auVar97._0_4_ + iVar88 + auVar103._0_4_ >> auVar100;
  iStack_2f4 = auVar97._4_4_ + iVar88 + auVar103._4_4_ >> auVar100;
  iStack_2f0 = auVar97._8_4_ + iVar88 + auVar103._8_4_ >> auVar100;
  iStack_2ec = auVar97._12_4_ + iVar88 + auVar103._12_4_ >> auVar100;
  local_2e8 = auVar96._0_4_ + iVar88 + auVar104._0_4_ >> auVar100;
  iStack_2e4 = auVar96._4_4_ + iVar88 + auVar104._4_4_ >> auVar100;
  iStack_2e0 = auVar96._8_4_ + iVar88 + auVar104._8_4_ >> auVar100;
  iStack_2dc = auVar96._12_4_ + iVar88 + auVar104._12_4_ >> auVar100;
  uVar76 = 0x20;
  do {
    uVar85 = uVar76 ^ 0xf;
    iVar79 = local_458[uVar85 * 4] + *puVar78;
    iVar84 = local_458[uVar85 * 4 + 1] + puVar78[1];
    iVar128 = local_458[uVar85 * 4 + 2] + puVar78[2];
    iVar134 = local_458[uVar85 * 4 + 3] + puVar78[3];
    iVar91 = *puVar78 - local_458[uVar85 * 4];
    iVar89 = puVar78[1] - local_458[uVar85 * 4 + 1];
    iVar82 = puVar78[2] - local_458[uVar85 * 4 + 2];
    iVar90 = puVar78[3] - local_458[uVar85 * 4 + 3];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    *puVar78 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[1] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[3] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    local_458[uVar85 * 4] =
         (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    local_458[uVar85 * 4 + 1] =
         (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    local_458[uVar85 * 4 + 2] =
         (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    local_458[uVar85 * 4 + 3] =
         (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    uVar76 = uVar76 + 1;
    puVar78 = puVar78 + 4;
  } while (uVar76 != 0x28);
  uVar76 = 0x30;
  puVar78 = local_158;
  do {
    uVar85 = uVar76 ^ 0xf;
    iVar79 = *puVar78 + local_458[uVar85 * 4];
    iVar84 = puVar78[1] + local_458[uVar85 * 4 + 1];
    iVar128 = puVar78[2] + local_458[uVar85 * 4 + 2];
    iVar134 = puVar78[3] + local_458[uVar85 * 4 + 3];
    iVar91 = local_458[uVar85 * 4] - *puVar78;
    iVar89 = local_458[uVar85 * 4 + 1] - puVar78[1];
    iVar82 = local_458[uVar85 * 4 + 2] - puVar78[2];
    iVar90 = local_458[uVar85 * 4 + 3] - puVar78[3];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar129 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar135 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar137 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    uVar139 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    local_458[uVar85 * 4] =
         (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    local_458[uVar85 * 4 + 1] =
         (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    local_458[uVar85 * 4 + 2] =
         (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    local_458[uVar85 * 4 + 3] =
         (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    *puVar78 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[1] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[2] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[3] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    uVar76 = uVar76 + 1;
    puVar78 = puVar78 + 4;
  } while (uVar76 != 0x38);
  puVar78 = local_268;
  lVar80 = 0;
  do {
    iVar91 = *(int *)((long)local_458 + lVar80 + 4);
    iVar89 = *(int *)((long)local_458 + lVar80 + 8);
    iVar82 = *(int *)((long)local_458 + lVar80 + 0xc);
    iVar79 = *puVar78 + *(int *)((long)local_458 + lVar80);
    iVar84 = puVar78[1] + iVar91;
    iVar128 = puVar78[2] + iVar89;
    iVar134 = puVar78[3] + iVar82;
    iVar90 = *(int *)((long)local_458 + lVar80) - *puVar78;
    iVar91 = iVar91 - puVar78[1];
    iVar89 = iVar89 - puVar78[2];
    iVar82 = iVar82 - puVar78[3];
    uVar165 = (uint)(iVar79 < iVar83) * iVar83 | (uint)(iVar79 >= iVar83) * iVar79;
    uVar171 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar173 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar175 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar129 = (uint)(iVar90 < iVar83) * iVar83 | (uint)(iVar90 >= iVar83) * iVar90;
    uVar135 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar137 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    uVar139 = (uint)(iVar82 < iVar83) * iVar83 | (uint)(iVar82 >= iVar83) * iVar82;
    *(uint *)((long)local_458 + lVar80) =
         (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    *(uint *)((long)local_458 + lVar80 + 4) =
         (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    *(uint *)((long)local_458 + lVar80 + 8) =
         (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    *(uint *)((long)local_458 + lVar80 + 0xc) =
         (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    *puVar78 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[1] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[2] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[3] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    lVar80 = lVar80 + 0x10;
    puVar78 = puVar78 + -4;
  } while (lVar80 != 0x100);
  auVar62._4_4_ = iStack_e4;
  auVar62._0_4_ = local_e8;
  auVar62._8_4_ = iStack_e0;
  auVar62._12_4_ = iStack_dc;
  auVar35._4_4_ = iStack_1d4;
  auVar35._0_4_ = local_1d8;
  auVar35._8_4_ = iStack_1d0;
  auVar35._12_4_ = iStack_1cc;
  auVar37._4_4_ = iStack_1c4;
  auVar37._0_4_ = local_1c8;
  auVar37._8_4_ = iStack_1c0;
  auVar37._12_4_ = iStack_1bc;
  auVar40._4_4_ = iStack_1b4;
  auVar40._0_4_ = local_1b8;
  auVar40._8_4_ = iStack_1b0;
  auVar40._12_4_ = iStack_1ac;
  auVar122._0_4_ = local_e8 + local_1d8;
  auVar122._4_4_ = iStack_e4 + iStack_1d4;
  auVar122._8_4_ = iStack_e0 + iStack_1d0;
  auVar122._12_4_ = iStack_dc + iStack_1cc;
  auVar97 = pmulld(auVar35,auVar115);
  auVar98 = pmulld(auVar62,auVar111);
  auVar60._4_4_ = iStack_f4;
  auVar60._0_4_ = local_f8;
  auVar60._8_4_ = iStack_f0;
  auVar60._12_4_ = iStack_ec;
  auVar133._0_4_ = local_f8 + local_1c8;
  auVar133._4_4_ = iStack_f4 + iStack_1c4;
  auVar133._8_4_ = iStack_f0 + iStack_1c0;
  auVar133._12_4_ = iStack_ec + iStack_1bc;
  auVar94 = pmulld(auVar37,auVar115);
  auVar95 = pmulld(auVar60,auVar111);
  auVar58._4_4_ = iStack_104;
  auVar58._0_4_ = local_108;
  auVar58._8_4_ = iStack_100;
  auVar58._12_4_ = iStack_fc;
  auVar118._0_4_ = local_108 + local_1b8;
  auVar118._4_4_ = iStack_104 + iStack_1b4;
  auVar118._8_4_ = iStack_100 + iStack_1b0;
  auVar118._12_4_ = iStack_fc + iStack_1ac;
  auVar159 = pmulld(auVar40,auVar115);
  auVar102 = pmulld(auVar58,auVar111);
  auVar43._4_4_ = iStack_1a4;
  auVar43._0_4_ = local_1a8;
  auVar43._8_4_ = iStack_1a0;
  auVar43._12_4_ = iStack_19c;
  auVar55._4_4_ = iStack_114;
  auVar55._0_4_ = local_118;
  auVar55._8_4_ = iStack_110;
  auVar55._12_4_ = iStack_10c;
  auVar150._0_4_ = local_118 + local_1a8;
  auVar150._4_4_ = iStack_114 + iStack_1a4;
  auVar150._8_4_ = iStack_110 + iStack_1a0;
  auVar150._12_4_ = iStack_10c + iStack_19c;
  auVar103 = pmulld(auVar43,auVar115);
  auVar104 = pmulld(auVar55,auVar111);
  auVar96 = pmulld(auVar150,auVar111);
  local_118 = auVar96._0_4_ + iVar88 >> auVar100;
  iStack_114 = auVar96._4_4_ + iVar88 >> auVar100;
  iStack_110 = auVar96._8_4_ + iVar88 >> auVar100;
  iStack_10c = auVar96._12_4_ + iVar88 >> auVar100;
  auVar96 = pmulld(auVar118,auVar111);
  auVar99 = pmulld(auVar133,auVar111);
  local_108 = auVar96._0_4_ + iVar88 >> auVar100;
  iStack_104 = auVar96._4_4_ + iVar88 >> auVar100;
  iStack_100 = auVar96._8_4_ + iVar88 >> auVar100;
  iStack_fc = auVar96._12_4_ + iVar88 >> auVar100;
  local_f8 = auVar99._0_4_ + iVar88 >> auVar100;
  iStack_f4 = auVar99._4_4_ + iVar88 >> auVar100;
  iStack_f0 = auVar99._8_4_ + iVar88 >> auVar100;
  iStack_ec = auVar99._12_4_ + iVar88 >> auVar100;
  auVar96 = pmulld(auVar122,auVar111);
  local_e8 = auVar96._0_4_ + iVar88 >> auVar100;
  iStack_e4 = auVar96._4_4_ + iVar88 >> auVar100;
  iStack_e0 = auVar96._8_4_ + iVar88 >> auVar100;
  iStack_dc = auVar96._12_4_ + iVar88 >> auVar100;
  local_1d8 = auVar97._0_4_ + iVar88 + auVar98._0_4_ >> auVar100;
  iStack_1d4 = auVar97._4_4_ + iVar88 + auVar98._4_4_ >> auVar100;
  iStack_1d0 = auVar97._8_4_ + iVar88 + auVar98._8_4_ >> auVar100;
  iStack_1cc = auVar97._12_4_ + iVar88 + auVar98._12_4_ >> auVar100;
  local_1c8 = auVar94._0_4_ + iVar88 + auVar95._0_4_ >> auVar100;
  iStack_1c4 = auVar94._4_4_ + iVar88 + auVar95._4_4_ >> auVar100;
  iStack_1c0 = auVar94._8_4_ + iVar88 + auVar95._8_4_ >> auVar100;
  iStack_1bc = auVar94._12_4_ + iVar88 + auVar95._12_4_ >> auVar100;
  local_1b8 = auVar159._0_4_ + iVar88 + auVar102._0_4_ >> auVar100;
  iStack_1b4 = auVar159._4_4_ + iVar88 + auVar102._4_4_ >> auVar100;
  iStack_1b0 = auVar159._8_4_ + iVar88 + auVar102._8_4_ >> auVar100;
  iStack_1ac = auVar159._12_4_ + iVar88 + auVar102._12_4_ >> auVar100;
  local_1a8 = auVar103._0_4_ + iVar88 + auVar104._0_4_ >> auVar100;
  iStack_1a4 = auVar103._4_4_ + iVar88 + auVar104._4_4_ >> auVar100;
  iStack_1a0 = auVar103._8_4_ + iVar88 + auVar104._8_4_ >> auVar100;
  iStack_19c = auVar103._12_4_ + iVar88 + auVar104._12_4_ >> auVar100;
  auVar52._4_4_ = iStack_124;
  auVar52._0_4_ = local_128;
  auVar52._8_4_ = iStack_120;
  auVar52._12_4_ = iStack_11c;
  auVar123._0_4_ = local_128 + local_198._0_4_;
  auVar123._4_4_ = iStack_124 + local_198._4_4_;
  auVar123._8_4_ = iStack_120 + local_198._8_4_;
  auVar123._12_4_ = iStack_11c + local_198._12_4_;
  auVar159 = pmulld(local_198,auVar115);
  auVar94 = pmulld(auVar52,auVar111);
  auVar45._4_4_ = iStack_184;
  auVar45._0_4_ = local_188;
  auVar45._8_4_ = iStack_180;
  auVar45._12_4_ = iStack_17c;
  auVar50._4_4_ = iStack_134;
  auVar50._0_4_ = local_138;
  auVar50._8_4_ = iStack_130;
  auVar50._12_4_ = iStack_12c;
  auVar127._0_4_ = local_138 + local_188;
  auVar127._4_4_ = iStack_134 + iStack_184;
  auVar127._8_4_ = iStack_130 + iStack_180;
  auVar127._12_4_ = iStack_12c + iStack_17c;
  auVar95 = pmulld(auVar45,auVar115);
  auVar96 = pmulld(auVar50,auVar111);
  auVar46._4_4_ = iStack_174;
  auVar46._0_4_ = local_178;
  auVar46._8_4_ = iStack_170;
  auVar46._12_4_ = iStack_16c;
  auVar48._4_4_ = local_158[5];
  auVar48._0_4_ = local_158[4];
  auVar48._8_4_ = local_158[6];
  auVar48._12_4_ = iStack_13c;
  auVar119._0_4_ = local_158[4] + local_178;
  auVar119._4_4_ = local_158[5] + iStack_174;
  auVar119._8_4_ = local_158[6] + iStack_170;
  auVar119._12_4_ = iStack_13c + iStack_16c;
  auVar99 = pmulld(auVar46,auVar115);
  auVar102 = pmulld(auVar48,auVar111);
  auVar47._4_4_ = local_158[1];
  auVar47._0_4_ = local_158[0];
  auVar47._8_4_ = local_158[2];
  auVar47._12_4_ = local_158[3];
  auVar104 = pmulld(auVar115,local_168);
  auVar103 = pmulld(auVar47,auVar111);
  auVar151._0_4_ = local_158[0] + local_168._0_4_;
  auVar151._4_4_ = local_158[1] + local_168._4_4_;
  auVar151._8_4_ = local_158[2] + local_168._8_4_;
  auVar151._12_4_ = local_158[3] + local_168._12_4_;
  auVar97 = pmulld(auVar151,auVar111);
  local_158[0] = auVar97._0_4_ + iVar88 >> auVar100;
  local_158[1] = auVar97._4_4_ + iVar88 >> auVar100;
  local_158[2] = auVar97._8_4_ + iVar88 >> auVar100;
  local_158[3] = auVar97._12_4_ + iVar88 >> auVar100;
  auVar97 = pmulld(auVar119,auVar111);
  local_158[4] = auVar97._0_4_ + iVar88 >> auVar100;
  local_158[5] = auVar97._4_4_ + iVar88 >> auVar100;
  local_158[6] = auVar97._8_4_ + iVar88 >> auVar100;
  iStack_13c = auVar97._12_4_ + iVar88 >> auVar100;
  auVar98 = pmulld(auVar127,auVar111);
  auVar97 = pmulld(auVar123,auVar111);
  local_138 = auVar98._0_4_ + iVar88 >> auVar100;
  iStack_134 = auVar98._4_4_ + iVar88 >> auVar100;
  iStack_130 = auVar98._8_4_ + iVar88 >> auVar100;
  iStack_12c = auVar98._12_4_ + iVar88 >> auVar100;
  local_128 = auVar97._0_4_ + iVar88 >> auVar100;
  iStack_124 = auVar97._4_4_ + iVar88 >> auVar100;
  iStack_120 = auVar97._8_4_ + iVar88 >> auVar100;
  iStack_11c = auVar97._12_4_ + iVar88 >> auVar100;
  local_198._4_4_ = auVar159._4_4_ + iVar88 + auVar94._4_4_ >> auVar100;
  local_198._0_4_ = auVar159._0_4_ + iVar88 + auVar94._0_4_ >> auVar100;
  local_198._8_4_ = auVar159._8_4_ + iVar88 + auVar94._8_4_ >> auVar100;
  local_198._12_4_ = auVar159._12_4_ + iVar88 + auVar94._12_4_ >> auVar100;
  local_188 = auVar95._0_4_ + iVar88 + auVar96._0_4_ >> auVar100;
  iStack_184 = auVar95._4_4_ + iVar88 + auVar96._4_4_ >> auVar100;
  iStack_180 = auVar95._8_4_ + iVar88 + auVar96._8_4_ >> auVar100;
  iStack_17c = auVar95._12_4_ + iVar88 + auVar96._12_4_ >> auVar100;
  local_178 = auVar99._0_4_ + iVar88 + auVar102._0_4_ >> auVar100;
  iStack_174 = auVar99._4_4_ + iVar88 + auVar102._4_4_ >> auVar100;
  iStack_170 = auVar99._8_4_ + iVar88 + auVar102._8_4_ >> auVar100;
  iStack_16c = auVar99._12_4_ + iVar88 + auVar102._12_4_ >> auVar100;
  local_168._4_4_ = auVar104._4_4_ + iVar88 + auVar103._4_4_ >> auVar100;
  local_168._0_4_ = auVar104._0_4_ + iVar88 + auVar103._0_4_ >> auVar100;
  local_168._8_4_ = auVar104._8_4_ + iVar88 + auVar103._8_4_ >> auVar100;
  local_168._12_4_ = auVar104._12_4_ + iVar88 + auVar103._12_4_ >> auVar100;
  lVar80 = 0x3f0;
  lVar81 = 0;
  do {
    iVar88 = *(int *)((long)local_458 + lVar81 + 4);
    iVar91 = *(int *)((long)local_458 + lVar81 + 8);
    iVar89 = *(int *)((long)local_458 + lVar81 + 0xc);
    iVar82 = *(int *)((long)local_458 + lVar80 + 4);
    iVar90 = *(int *)((long)local_458 + lVar80 + 8);
    iVar79 = *(int *)((long)local_458 + lVar80 + 0xc);
    iVar128 = *(int *)((long)local_458 + lVar80) + *(int *)((long)local_458 + lVar81);
    iVar134 = iVar82 + iVar88;
    iVar136 = iVar90 + iVar91;
    iVar138 = iVar79 + iVar89;
    iVar84 = *(int *)((long)local_458 + lVar81) - *(int *)((long)local_458 + lVar80);
    iVar88 = iVar88 - iVar82;
    iVar91 = iVar91 - iVar90;
    iVar89 = iVar89 - iVar79;
    uVar165 = (uint)(iVar128 < iVar83) * iVar83 | (uint)(iVar128 >= iVar83) * iVar128;
    uVar171 = (uint)(iVar134 < iVar83) * iVar83 | (uint)(iVar134 >= iVar83) * iVar134;
    uVar173 = (uint)(iVar136 < iVar83) * iVar83 | (uint)(iVar136 >= iVar83) * iVar136;
    uVar175 = (uint)(iVar138 < iVar83) * iVar83 | (uint)(iVar138 >= iVar83) * iVar138;
    uVar129 = (uint)(iVar84 < iVar83) * iVar83 | (uint)(iVar84 >= iVar83) * iVar84;
    uVar135 = (uint)(iVar88 < iVar83) * iVar83 | (uint)(iVar88 >= iVar83) * iVar88;
    uVar137 = (uint)(iVar91 < iVar83) * iVar83 | (uint)(iVar91 >= iVar83) * iVar91;
    uVar139 = (uint)(iVar89 < iVar83) * iVar83 | (uint)(iVar89 >= iVar83) * iVar89;
    puVar78 = (uint *)((long)*out + lVar81);
    *puVar78 = (uint)(iVar75 < (int)uVar165) * iVar75 | (iVar75 >= (int)uVar165) * uVar165;
    puVar78[1] = (uint)(iVar75 < (int)uVar171) * iVar75 | (iVar75 >= (int)uVar171) * uVar171;
    puVar78[2] = (uint)(iVar75 < (int)uVar173) * iVar75 | (iVar75 >= (int)uVar173) * uVar173;
    puVar78[3] = (uint)(iVar75 < (int)uVar175) * iVar75 | (iVar75 >= (int)uVar175) * uVar175;
    puVar78 = (uint *)((long)*out + lVar80);
    *puVar78 = (uint)(iVar75 < (int)uVar129) * iVar75 | (iVar75 >= (int)uVar129) * uVar129;
    puVar78[1] = (uint)(iVar75 < (int)uVar135) * iVar75 | (iVar75 >= (int)uVar135) * uVar135;
    puVar78[2] = (uint)(iVar75 < (int)uVar137) * iVar75 | (iVar75 >= (int)uVar137) * uVar137;
    puVar78[3] = (uint)(iVar75 < (int)uVar139) * iVar75 | (iVar75 >= (int)uVar139) * uVar139;
    lVar80 = lVar80 + -0x10;
    lVar81 = lVar81 + 0x10;
  } while (lVar80 != 0x1f0);
  if (do_cols == 0) {
    iVar75 = 10;
    if (10 < bd) {
      iVar75 = bd;
    }
    local_58 = 0x20 << ((byte)iVar75 & 0x1f);
    local_48 = -local_58;
    local_58 = local_58 + -1;
    iVar75 = 1 << ((char)out_shift - 1U & 0x1f);
    uVar76 = 0xfffffffffffffffc;
    auVar159 = ZEXT416((uint)out_shift);
    iStack_54 = local_58;
    iStack_50 = local_58;
    iStack_4c = local_58;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    do {
      if (out_shift != 0) {
        iVar88 = *(int *)((long)*out + 4);
        lVar68 = (*out)[1];
        iVar91 = *(int *)((long)*out + 0xc);
        lVar69 = out[1][0];
        iVar89 = *(int *)((long)out[1] + 4);
        lVar70 = out[1][1];
        iVar82 = *(int *)((long)out[1] + 0xc);
        lVar71 = out[2][0];
        iVar90 = *(int *)((long)out[2] + 4);
        lVar72 = out[2][1];
        iVar79 = *(int *)((long)out[2] + 0xc);
        lVar73 = out[3][0];
        iVar83 = *(int *)((long)out[3] + 4);
        lVar74 = out[3][1];
        iVar84 = *(int *)((long)out[3] + 0xc);
        *(int *)*out = (int)(*out)[0] + iVar75 >> auVar159;
        *(int *)((long)*out + 4) = iVar88 + iVar75 >> auVar159;
        *(int *)(*out + 1) = (int)lVar68 + iVar75 >> auVar159;
        *(int *)((long)*out + 0xc) = iVar91 + iVar75 >> auVar159;
        *(int *)out[1] = (int)lVar69 + iVar75 >> auVar159;
        *(int *)((long)out[1] + 4) = iVar89 + iVar75 >> auVar159;
        *(int *)(out[1] + 1) = (int)lVar70 + iVar75 >> auVar159;
        *(int *)((long)out[1] + 0xc) = iVar82 + iVar75 >> auVar159;
        *(int *)out[2] = (int)lVar71 + iVar75 >> auVar159;
        *(int *)((long)out[2] + 4) = iVar90 + iVar75 >> auVar159;
        *(int *)(out[2] + 1) = (int)lVar72 + iVar75 >> auVar159;
        *(int *)((long)out[2] + 0xc) = iVar79 + iVar75 >> auVar159;
        *(int *)out[3] = (int)lVar73 + iVar75 >> auVar159;
        *(int *)((long)out[3] + 4) = iVar83 + iVar75 >> auVar159;
        *(int *)(out[3] + 1) = (int)lVar74 + iVar75 >> auVar159;
        *(int *)((long)out[3] + 0xc) = iVar84 + iVar75 >> auVar159;
      }
      highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_48,(__m128i *)&local_58,4);
      uVar76 = uVar76 + 4;
      out = out + 4;
    } while (uVar76 < 0x3c);
  }
  return;
}

Assistant:

static void idct64x64_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi9 = _mm_set1_epi32(cospi[9]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi11 = _mm_set1_epi32(cospi[11]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi13 = _mm_set1_epi32(cospi[13]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi15 = _mm_set1_epi32(cospi[15]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi51 = _mm_set1_epi32(cospi[51]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi55 = _mm_set1_epi32(cospi[55]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);

  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim44 = _mm_set1_epi32(-cospi[44]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim49 = _mm_set1_epi32(-cospi[49]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim53 = _mm_set1_epi32(-cospi[53]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim60 = _mm_set1_epi32(-cospi[60]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);

  {
    __m128i u[64];
    __m128i tmp1, tmp2, tmp3, tmp4;
    // stage 1
    u[0] = in[0];
    u[32] = in[1];
    u[36] = in[9];
    u[40] = in[5];
    u[44] = in[13];
    u[48] = in[3];
    u[52] = in[11];
    u[56] = in[7];
    u[60] = in[15];
    u[16] = in[2];
    u[20] = in[10];
    u[24] = in[6];
    u[28] = in[14];
    u[4] = in[8];
    u[8] = in[4];
    u[12] = in[12];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[35] = half_btf_0_sse4_1(&cospim49, &u[60], &rnding, bit);
    u[60] = half_btf_0_sse4_1(&cospi15, &u[60], &rnding, bit);
    u[59] = half_btf_0_sse4_1(&cospi9, &u[36], &rnding, bit);
    u[36] = half_btf_0_sse4_1(&cospi55, &u[36], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[43] = half_btf_0_sse4_1(&cospim53, &u[52], &rnding, bit);
    u[52] = half_btf_0_sse4_1(&cospi11, &u[52], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);
    u[51] = half_btf_0_sse4_1(&cospi13, &u[44], &rnding, bit);
    u[44] = half_btf_0_sse4_1(&cospi51, &u[44], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[19] = half_btf_0_sse4_1(&cospim50, &u[28], &rnding, bit);
    u[28] = half_btf_0_sse4_1(&cospi14, &u[28], &rnding, bit);
    u[27] = half_btf_0_sse4_1(&cospi10, &u[20], &rnding, bit);
    u[20] = half_btf_0_sse4_1(&cospi54, &u[20], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[34] = u[35];
    u[37] = u[36];
    u[38] = u[39];
    u[41] = u[40];
    u[42] = u[43];
    u[45] = u[44];
    u[46] = u[47];
    u[49] = u[48];
    u[50] = u[51];
    u[53] = u[52];
    u[54] = u[55];
    u[57] = u[56];
    u[58] = u[59];
    u[61] = u[60];
    u[62] = u[63];

    // stage 4
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
    u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

    u[17] = u[16];
    u[18] = u[19];
    u[21] = u[20];
    u[22] = u[23];
    u[25] = u[24];
    u[26] = u[27];
    u[29] = u[28];
    u[30] = u[31];

    tmp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim60, &u[34], &cospim4, &u[61], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim36, &u[37], &cospi28, &u[58], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospi28, &u[37], &cospi36, &u[58], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospim4, &u[34], &cospi60, &u[61], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = tmp1;
    u[34] = tmp2;
    u[37] = tmp3;
    u[38] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim44, &u[42], &cospim20, &u[53], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim52, &u[45], &cospi12, &u[50], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospi12, &u[45], &cospi52, &u[50], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospim20, &u[42], &cospi44, &u[53], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = tmp1;
    u[42] = tmp2;
    u[45] = tmp3;
    u[46] = tmp4;

    // stage 5
    u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
    u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);

    u[9] = u[8];
    u[10] = u[11];
    u[13] = u[12];
    u[14] = u[15];

    tmp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim56, &u[18], &cospim8, &u[29], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim40, &u[21], &cospi24, &u[26], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospi24, &u[21], &cospi40, &u[26], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospim8, &u[18], &cospi56, &u[29], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = tmp1;
    u[18] = tmp2;
    u[21] = tmp3;
    u[22] = tmp4;

    for (i = 32; i < 64; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    // stage 6
    tmp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = tmp1;
    u[5] = u[4];
    u[6] = u[7];

    tmp1 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = tmp1;
    tmp2 = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    u[10] = tmp2;

    for (i = 16; i < 32; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    tmp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = tmp1;
    u[35] = tmp2;
    u[36] = tmp3;
    u[37] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = tmp1;
    u[43] = tmp2;
    u[44] = tmp3;
    u[45] = tmp4;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    tmp1 = half_btf_sse4_1(&cospim32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[6] = half_btf_sse4_1(&cospi32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[5] = tmp1;
    addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    tmp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = tmp1;
    u[19] = tmp2;
    u[20] = tmp3;
    u[21] = tmp4;

    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    for (i = 0; i < 4; ++i) {
      addsub_sse4_1(u[i], u[7 - i], &u[i], &u[7 - i], &clamp_lo, &clamp_hi);
    }

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}